

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3833.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementShellANCF_3833::ComputeInternalForcesContIntDamping
          (ChElementShellANCF_3833 *this,ChVectorDynamic<> *Fi)

{
  long lVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  ChKblockGeneric *pCVar99;
  ChVectorDynamic<> *pCVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  undefined8 uVar132;
  undefined8 uVar133;
  undefined8 uVar134;
  undefined8 uVar135;
  undefined8 uVar136;
  undefined8 uVar137;
  undefined8 uVar138;
  undefined8 uVar139;
  undefined8 uVar140;
  undefined8 uVar141;
  undefined8 uVar142;
  undefined8 uVar143;
  undefined8 uVar144;
  undefined8 uVar145;
  undefined8 uVar146;
  undefined8 uVar147;
  undefined8 uVar148;
  undefined8 uVar149;
  undefined8 uVar150;
  undefined8 uVar151;
  undefined8 uVar152;
  undefined8 uVar153;
  undefined8 uVar154;
  undefined8 uVar155;
  undefined8 uVar156;
  undefined8 uVar157;
  undefined8 uVar158;
  undefined8 uVar159;
  undefined8 uVar160;
  undefined8 uVar161;
  undefined8 uVar162;
  undefined8 uVar163;
  undefined8 uVar164;
  undefined8 uVar165;
  undefined8 uVar166;
  undefined8 uVar167;
  undefined8 uVar168;
  undefined8 uVar169;
  undefined8 uVar170;
  undefined8 uVar171;
  undefined8 uVar172;
  undefined8 uVar173;
  undefined8 uVar174;
  undefined8 uVar175;
  undefined8 uVar176;
  undefined8 uVar177;
  undefined8 uVar178;
  ulong uVar179;
  void *pvVar180;
  undefined8 *puVar181;
  double *pdVar182;
  char *__function;
  double dVar183;
  ulong uVar184;
  ChElementShellANCF_3833 *this_00;
  Matrix<double,__1,__1,_1,__1,__1> *pMVar185;
  pointer pLVar186;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  VectorNIP E_BlockDamping;
  VectorNIP SPK2_6_Block;
  VectorNIP SPK2_5_Block;
  VectorNIP SPK2_4_Block;
  VectorNIP SPK2_3_Block;
  VectorNIP SPK2_2_Block;
  ChMatrixNMc<double,_3_*_NIP,_6> FC;
  VectorNIP SPK2_1_Block;
  VectorNIP E6_Block;
  VectorNIP E5_Block;
  VectorNIP E4_Block;
  ChMatrixNM<double,_6,_6> D;
  ChMatrixNMc<double,_3_*_NIP,_3> P_Block;
  MatrixNx3 QiCompact;
  MatrixNx6 ebar_ebardot;
  Scalar local_2260;
  undefined1 *local_2258;
  double local_2250;
  double dStack_2248;
  double local_2240 [4];
  double local_2220;
  double dStack_2218;
  undefined1 local_2210 [16];
  undefined1 local_2200 [16];
  undefined1 local_21f0 [16];
  undefined1 local_21e0 [16];
  undefined1 local_21d0 [16];
  double local_21c0;
  double *local_21b8;
  double local_21b0;
  double *pdStack_21a8;
  double local_21a0 [4];
  double local_2180;
  double dStack_2178;
  double local_2170;
  double dStack_2168;
  double local_2160;
  double dStack_2158;
  double local_2150;
  double dStack_2148;
  double local_2140;
  double dStack_2138;
  double local_2130;
  double dStack_2128;
  pointer local_2120;
  double *pdStack_2118;
  double local_2110 [4];
  double local_20f0;
  double dStack_20e8;
  double local_20e0;
  double dStack_20d8;
  double local_20d0;
  double dStack_20c8;
  double local_20c0;
  double dStack_20b8;
  double local_20b0;
  double dStack_20a8;
  double local_20a0;
  double dStack_2098;
  pointer local_2090;
  double *pdStack_2088;
  double local_2080 [4];
  double local_2060;
  double dStack_2058;
  double local_2050;
  double dStack_2048;
  double local_2040;
  double dStack_2038;
  double local_2030;
  double dStack_2028;
  double local_2020;
  double dStack_2018;
  double local_2010;
  double dStack_2008;
  undefined1 local_2000 [16];
  Matrix<double,__1,__1,_1,__1,__1> *local_1ff0;
  variable_if_dynamic<long,__1> local_1fe8;
  variable_if_dynamic<long,__1> local_1fe0;
  long local_1fd8;
  Matrix<double,_54,_3,_0,_54,_3> *local_1fd0;
  double local_1fc0;
  undefined1 *local_1fb8;
  ChElementShellANCF_3833 *local_1fb0;
  ulong local_1fa8;
  double local_1fa0;
  double dStack_1f98;
  undefined1 local_1f90 [16];
  undefined1 local_1f80 [24];
  ChVectorDynamic<> *local_1f68;
  Matrix<double,__1,__1,_1,__1,__1> *local_1f60;
  long local_1f58;
  double local_1f50;
  long local_1f48;
  pointer local_1f40;
  double *pdStack_1f38;
  double local_1f30 [4];
  double local_1f10;
  double dStack_1f08;
  double local_1f00;
  double dStack_1ef8;
  double local_1ef0;
  double dStack_1ee8;
  double local_1ee0;
  double dStack_1ed8;
  double local_1ed0;
  double dStack_1ec8;
  double local_1ec0;
  double dStack_1eb8;
  _func_int **local_1eb0;
  double *pdStack_1ea8;
  double local_1ea0 [4];
  double local_1e80;
  double dStack_1e78;
  double local_1e70;
  double dStack_1e68;
  double local_1e60;
  double dStack_1e58;
  double local_1e50;
  double dStack_1e48;
  double local_1e40;
  double dStack_1e38;
  double local_1e30;
  double dStack_1e28;
  undefined1 local_1e20 [1408];
  undefined1 local_18a0 [16];
  undefined1 local_1890 [16];
  double local_1880;
  double dStack_1878;
  double local_1870 [4];
  double local_1850;
  double dStack_1848;
  double local_1840;
  double dStack_1838;
  undefined1 local_1830 [16];
  undefined1 local_1820 [16];
  undefined1 local_1810 [16];
  undefined1 local_1800 [16];
  double local_17f0;
  double dStack_17e8;
  undefined1 local_17e0 [16];
  undefined1 local_17d0 [16];
  undefined1 local_17c0 [16];
  double local_17b0;
  double dStack_17a8;
  double local_17a0;
  double dStack_1798;
  double local_1790;
  double dStack_1788;
  undefined1 local_1780 [16];
  undefined1 local_1770 [16];
  double local_1760;
  double dStack_1758;
  double local_1750 [4];
  double local_1730;
  double dStack_1728;
  undefined1 local_1720 [16];
  undefined1 local_1710 [16];
  undefined1 local_1700 [16];
  undefined1 local_16f0 [16];
  undefined1 local_16e0 [16];
  double local_16d0;
  double dStack_16c8;
  double local_16c0 [4];
  double local_16a0;
  double dStack_1698;
  undefined1 local_1690 [16];
  undefined1 local_1680 [16];
  undefined1 local_1670 [16];
  undefined1 local_1660 [16];
  undefined1 local_1650 [16];
  double local_1640;
  double dStack_1638;
  undefined1 local_1630 [16];
  undefined1 local_1620 [16];
  undefined1 local_1610 [16];
  undefined1 local_1600 [16];
  double local_15f0;
  double dStack_15e8;
  double local_15e0;
  double dStack_15d8;
  undefined1 local_15d0 [16];
  undefined1 local_15c0 [16];
  double local_15b0;
  double dStack_15a8;
  double local_15a0 [4];
  double local_1580;
  double dStack_1578;
  undefined1 local_1570 [16];
  undefined1 local_1560 [16];
  undefined1 local_1550 [16];
  undefined1 local_1540 [16];
  undefined1 local_1530 [16];
  double local_1520;
  double dStack_1518;
  double local_1510 [4];
  double local_14f0;
  double dStack_14e8;
  undefined1 local_14e0 [16];
  undefined1 local_14d0 [16];
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [16];
  undefined1 local_14a0 [16];
  double local_1490;
  double dStack_1488;
  undefined1 local_1480 [16];
  undefined1 local_1470 [16];
  undefined1 local_1460 [16];
  undefined1 local_1450 [16];
  double local_1440;
  double dStack_1438;
  undefined1 local_1430 [16];
  double local_1420;
  double dStack_1418;
  double local_1410;
  double dStack_1408;
  double local_13f0;
  double dStack_13e8;
  double local_13e0 [4];
  double local_13c0;
  double dStack_13b8;
  double local_13b0;
  double dStack_13a8;
  double local_13a0;
  double dStack_1398;
  double local_1390;
  double dStack_1388;
  double local_1380;
  double dStack_1378;
  double local_1370;
  double dStack_1368;
  double local_1360;
  double dStack_1358;
  double local_1350 [4];
  double local_1330;
  double dStack_1328;
  double local_1320;
  double dStack_1318;
  double local_1310;
  double dStack_1308;
  double local_1300;
  double dStack_12f8;
  double local_12f0;
  double dStack_12e8;
  double local_12e0;
  double dStack_12d8;
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  double local_12a0;
  double dStack_1298;
  double local_1290;
  double dStack_1288;
  double local_1280;
  double dStack_1278;
  double local_1270;
  double dStack_1268;
  double local_1260;
  double dStack_1258;
  undefined1 local_1250 [16];
  double local_1240;
  double dStack_1238;
  double local_1230 [4];
  double local_1210;
  double dStack_1208;
  double local_1200;
  double dStack_11f8;
  double local_11f0;
  double dStack_11e8;
  double local_11e0;
  double dStack_11d8;
  double local_11d0;
  double dStack_11c8;
  double local_11c0;
  double dStack_11b8;
  undefined1 local_11b0 [16];
  undefined1 local_11a0 [16];
  undefined1 local_1190 [16];
  undefined1 local_1180 [16];
  double local_1170;
  double dStack_1168;
  double local_1160;
  double dStack_1158;
  double local_1150;
  double dStack_1148;
  double local_1140;
  double dStack_1138;
  double local_1130;
  double dStack_1128;
  double local_1120;
  double dStack_1118;
  double local_1110 [4];
  double local_10f0;
  double dStack_10e8;
  double local_10e0;
  double dStack_10d8;
  double local_10d0;
  double dStack_10c8;
  double local_10c0;
  double dStack_10b8;
  double local_10b0;
  double dStack_10a8;
  double local_10a0;
  double dStack_1098;
  double local_1090;
  double dStack_1088;
  double local_1080 [4];
  double local_1060;
  double dStack_1058;
  double local_1050;
  double dStack_1048;
  double local_1040;
  double dStack_1038;
  double local_1030;
  double dStack_1028;
  double local_1020;
  double dStack_1018;
  undefined1 local_1010 [16];
  double local_1000;
  double dStack_ff8;
  double local_ff0;
  double dStack_fe8;
  double local_f50;
  double *local_f48;
  undefined1 local_f40 [96];
  pointer local_ee0;
  pointer local_ed8;
  pointer local_ed0;
  pointer local_ec8;
  pointer local_ec0;
  pointer local_eb8;
  pointer local_eb0;
  pointer local_ea8;
  pointer local_ea0;
  double local_e98;
  double local_e90;
  double local_e88;
  double local_e80;
  double local_e78;
  double local_e70;
  double local_e68;
  double local_e60;
  double local_e58;
  double local_e50;
  PointerType local_e48;
  double local_e40;
  double local_e38;
  double local_e30;
  double local_e28;
  double local_e00;
  double dStack_df8;
  double local_df0;
  double dStack_de8;
  double local_de0;
  double dStack_dd8;
  double local_dc0;
  double dStack_db8;
  double local_da0;
  double dStack_d98;
  double local_d70;
  double dStack_d68;
  double local_d50;
  double dStack_d48;
  double local_d10;
  double dStack_d08;
  double local_d00;
  double dStack_cf8;
  double local_cf0;
  double dStack_ce8;
  double local_cd0;
  double dStack_cc8;
  double local_c70;
  double dStack_c68;
  Matrix<double,_54,_3,_0,_54,_3> local_c50;
  Matrix<double,_24,_3,_1,_24,_3> local_740;
  MatrixNx6 local_500;
  
  local_1f68 = Fi;
  CalcCombinedCoordMatrix(this,&local_500);
  memset(&local_740,0,0x240);
  if (this->m_numLayers != 0) {
    pMVar185 = &this->m_SD;
    uVar179 = 0;
    local_ff0 = -1.0;
    dStack_fe8 = -1.0;
    local_1000 = 0.5;
    dStack_ff8 = 0.5;
    local_1fb0 = this;
    local_1f60 = pMVar185;
    do {
      dVar183 = (double)(uVar179 * 0x36);
      local_1fa8 = uVar179;
      if (((long)dVar183 < 0) ||
         ((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
          m_rows < 0x18)) {
LAB_00745be6:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, 24, 54>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = 24, BlockCols = 54, InnerPanel = false]"
        ;
LAB_00745bfb:
        __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,__function);
      }
      dVar4 = (double)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                      m_storage.m_cols;
      local_1f48 = (long)dVar183 + 0x36;
      if ((long)dVar4 < local_1f48) goto LAB_00745be6;
      local_1f58 = uVar179 * 0x1b0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = (double)((this->m_SD).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                          .m_data + uVar179 * 0x36);
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[3] = 0.0;
      local_1f50 = dVar183;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[2] = (double)pMVar185;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[4] = dVar183;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[5] = dVar4;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[6] = (double)&local_500;
      memset((Matrix<double,_54,_6,_0,_54,_6> *)local_1e20,0,0xa20);
      local_f40._0_8_ = (_func_int **)0x3ff0000000000000;
      Eigen::internal::
      generic_product_impl<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,24,54,false>>,Eigen::Matrix<double,24,6,1,24,6>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,54,6,0,54,6>>
                ((Matrix<double,_54,_6,_0,_54,_6> *)local_1e20,
                 (Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false>_>
                  *)&local_c50,&local_500,(Scalar *)local_f40);
      uVar132 = local_1e20._1288_8_;
      uVar131 = local_1e20._1280_8_;
      uVar178 = local_1e20._1256_8_;
      uVar177 = local_1e20._1248_8_;
      uVar130 = local_1e20._1240_8_;
      uVar129 = local_1e20._1232_8_;
      uVar176 = local_1e20._1192_8_;
      uVar175 = local_1e20._1184_8_;
      uVar128 = local_1e20._856_8_;
      uVar127 = local_1e20._848_8_;
      uVar150 = local_1e20._840_8_;
      uVar149 = local_1e20._832_8_;
      uVar148 = local_1e20._824_8_;
      uVar147 = local_1e20._816_8_;
      uVar126 = local_1e20._792_8_;
      uVar125 = local_1e20._784_8_;
      uVar106 = local_1e20._392_8_;
      uVar105 = local_1e20._384_8_;
      uVar104 = local_1e20._376_8_;
      uVar103 = local_1e20._368_8_;
      uVar102 = local_1e20._360_8_;
      uVar101 = local_1e20._352_8_;
      uVar124 = local_1e20._344_8_;
      uVar123 = local_1e20._336_8_;
      uVar122 = local_1e20._328_8_;
      uVar121 = local_1e20._320_8_;
      uVar120 = local_1e20._296_8_;
      uVar119 = local_1e20._288_8_;
      uVar179 = local_1fa8;
      auVar194._8_8_ = local_1e20._536_8_;
      auVar194._0_8_ = local_1e20._528_8_;
      auVar202._8_8_ = local_1e20._968_8_;
      auVar202._0_8_ = local_1e20._960_8_;
      auVar197._8_8_ = local_1e20._120_8_;
      auVar197._0_8_ = local_1e20._112_8_;
      auVar203._8_8_ = local_1e20._984_8_;
      auVar203._0_8_ = local_1e20._976_8_;
      auVar204._8_8_ = local_1e20._1000_8_;
      auVar204._0_8_ = local_1e20._992_8_;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[1] = (double)&local_2250;
      auVar187 = vmulpd_avx512vl(auVar194,local_1700);
      auVar188 = vmulpd_avx512vl(auVar202,local_1550);
      auVar189 = vmulpd_avx512vl(auVar203,local_1540);
      auVar190 = vmulpd_avx512vl(auVar204,local_1530);
      lVar1 = local_1fa8 * 0x12 + 0x12;
      local_2250 = (double)local_1e20._0_8_ * (double)local_1e20._1296_8_ +
                   (double)local_1e20._432_8_ * local_1760 + (double)local_1e20._864_8_ * local_15b0
      ;
      dStack_2248 = (double)local_1e20._8_8_ * (double)local_1e20._1304_8_ +
                    (double)local_1e20._440_8_ * dStack_1758 +
                    (double)local_1e20._872_8_ * dStack_15a8;
      local_2220 = (double)local_1e20._48_8_ * (double)local_1e20._1344_8_ +
                   (double)local_1e20._480_8_ * local_1730 + (double)local_1e20._912_8_ * local_1580
      ;
      dStack_2218 = (double)local_1e20._56_8_ * (double)local_1e20._1352_8_ +
                    (double)local_1e20._488_8_ * dStack_1728 +
                    (double)local_1e20._920_8_ * dStack_1578;
      auVar192._8_8_ = local_1e20._504_8_;
      auVar192._0_8_ = local_1e20._496_8_;
      auVar191 = vmulpd_avx512vl(auVar192,local_1720);
      auVar192 = vmulpd_avx512vl(auVar194,auVar194);
      local_2240[0] =
           (double)local_1e20._880_8_ * local_15a0[0] +
           (double)local_1e20._16_8_ * (double)local_1e20._1312_8_ +
           (double)local_1e20._448_8_ * local_1750[0];
      local_2240[1] =
           (double)local_1e20._888_8_ * local_15a0[1] +
           (double)local_1e20._24_8_ * (double)local_1e20._1320_8_ +
           (double)local_1e20._456_8_ * local_1750[1];
      local_2240[2] =
           (double)local_1e20._896_8_ * local_15a0[2] +
           (double)local_1e20._464_8_ * local_1750[2] +
           (double)local_1e20._32_8_ * (double)local_1e20._1328_8_;
      local_2240[3] =
           (double)local_1e20._904_8_ * local_15a0[3] +
           (double)local_1e20._472_8_ * local_1750[3] +
           (double)local_1e20._40_8_ * (double)local_1e20._1336_8_;
      auVar242._0_8_ = (double)local_1e20._64_8_ * (double)local_1e20._1360_8_;
      auVar242._8_8_ = (double)local_1e20._72_8_ * (double)local_1e20._1368_8_;
      auVar191 = vaddpd_avx512vl(auVar242,auVar191);
      auVar196._8_8_ = local_1e20._936_8_;
      auVar196._0_8_ = local_1e20._928_8_;
      auVar193 = vmulpd_avx512vl(auVar196,local_1570);
      auVar194 = vmulpd_avx512vl(auVar196,auVar196);
      auVar91._8_8_ = dStack_ff8;
      auVar91._0_8_ = local_1000;
      local_2210 = vaddpd_avx512vl(auVar191,auVar193);
      auVar195._8_8_ = local_1e20._520_8_;
      auVar195._0_8_ = local_1e20._512_8_;
      auVar191 = vmulpd_avx512vl(auVar195,local_1710);
      auVar243._0_8_ = (double)local_1e20._80_8_ * (double)local_1e20._1376_8_;
      auVar243._8_8_ = (double)local_1e20._88_8_ * (double)local_1e20._1384_8_;
      auVar195 = vmulpd_avx512vl(auVar195,auVar195);
      auVar191 = vaddpd_avx512vl(auVar243,auVar191);
      auVar199._8_8_ = local_1e20._952_8_;
      auVar199._0_8_ = local_1e20._944_8_;
      auVar193 = vmulpd_avx512vl(auVar199,local_1560);
      auVar196 = vmulpd_avx512vl(auVar199,auVar199);
      local_2200 = vaddpd_avx512vl(auVar191,auVar193);
      auVar193._8_8_ = local_1e20._104_8_;
      auVar193._0_8_ = local_1e20._96_8_;
      auVar191 = vmulpd_avx512vl(auVar193,local_1e20._1392_16_);
      auVar200._8_8_ = local_1e20._136_8_;
      auVar200._0_8_ = local_1e20._128_8_;
      auVar193 = vmulpd_avx512vl(auVar193,auVar193);
      auVar187 = vaddpd_avx512vl(auVar191,auVar187);
      auVar191 = vmulpd_avx512vl(auVar202,auVar202);
      local_21f0 = vaddpd_avx512vl(auVar187,auVar188);
      auVar198._8_8_ = local_1e20._552_8_;
      auVar198._0_8_ = local_1e20._544_8_;
      auVar187 = vmulpd_avx512vl(auVar197,auVar197);
      auVar188 = vmulpd_avx512vl(auVar198,local_16f0);
      auVar197 = vmulpd_avx512vl(auVar197,local_18a0);
      auVar198 = vmulpd_avx512vl(auVar198,auVar198);
      auVar199 = vmulpd_avx512vl(auVar203,auVar203);
      auVar188 = vaddpd_avx512vl(auVar197,auVar188);
      local_21e0 = vaddpd_avx512vl(auVar188,auVar189);
      auVar201._8_8_ = local_1e20._568_8_;
      auVar201._0_8_ = local_1e20._560_8_;
      auVar188 = vmulpd_avx512vl(auVar201,local_16e0);
      auVar189 = vmulpd_avx512vl(auVar200,local_1890);
      auVar197 = vmulpd_avx512vl(auVar201,auVar201);
      auVar200 = vmulpd_avx512vl(auVar204,auVar204);
      auVar188 = vaddpd_avx512vl(auVar189,auVar188);
      local_21d0 = vaddpd_avx512vl(auVar188,auVar190);
      auVar220._0_8_ =
           local_ff0 +
           (double)local_1e20._0_8_ * (double)local_1e20._0_8_ +
           (double)local_1e20._432_8_ * (double)local_1e20._432_8_ +
           (double)local_1e20._864_8_ * (double)local_1e20._864_8_;
      auVar220._8_8_ =
           dStack_fe8 +
           (double)local_1e20._8_8_ * (double)local_1e20._8_8_ +
           (double)local_1e20._440_8_ * (double)local_1e20._440_8_ +
           (double)local_1e20._872_8_ * (double)local_1e20._872_8_;
      auVar205._0_8_ =
           local_ff0 +
           (double)local_1e20._32_8_ * (double)local_1e20._32_8_ +
           (double)local_1e20._464_8_ * (double)local_1e20._464_8_ +
           (double)local_1e20._896_8_ * (double)local_1e20._896_8_;
      auVar205._8_8_ =
           dStack_fe8 +
           (double)local_1e20._40_8_ * (double)local_1e20._40_8_ +
           (double)local_1e20._472_8_ * (double)local_1e20._472_8_ +
           (double)local_1e20._904_8_ * (double)local_1e20._904_8_;
      auVar225._0_8_ =
           local_ff0 +
           (double)local_1e20._48_8_ * (double)local_1e20._48_8_ +
           (double)local_1e20._480_8_ * (double)local_1e20._480_8_ +
           (double)local_1e20._912_8_ * (double)local_1e20._912_8_;
      auVar225._8_8_ =
           dStack_fe8 +
           (double)local_1e20._56_8_ * (double)local_1e20._56_8_ +
           (double)local_1e20._488_8_ * (double)local_1e20._488_8_ +
           (double)local_1e20._920_8_ * (double)local_1e20._920_8_;
      auVar228._0_8_ =
           local_ff0 +
           (double)local_1e20._64_8_ * (double)local_1e20._64_8_ +
           (double)local_1e20._496_8_ * (double)local_1e20._496_8_ + auVar194._0_8_;
      auVar228._8_8_ =
           dStack_fe8 +
           (double)local_1e20._72_8_ * (double)local_1e20._72_8_ +
           (double)local_1e20._504_8_ * (double)local_1e20._504_8_ + auVar194._8_8_;
      auVar231._0_8_ =
           local_ff0 +
           (double)local_1e20._80_8_ * (double)local_1e20._80_8_ + auVar195._0_8_ + auVar196._0_8_;
      auVar231._8_8_ =
           dStack_fe8 +
           (double)local_1e20._88_8_ * (double)local_1e20._88_8_ + auVar195._8_8_ + auVar196._8_8_;
      auVar233._0_8_ = local_ff0 + auVar193._0_8_ + auVar192._0_8_ + auVar191._0_8_;
      auVar233._8_8_ = dStack_fe8 + auVar193._8_8_ + auVar192._8_8_ + auVar191._8_8_;
      auVar236._0_8_ = local_ff0 + auVar199._0_8_ + auVar198._0_8_ + auVar187._0_8_;
      auVar236._8_8_ = dStack_fe8 + auVar199._8_8_ + auVar198._8_8_ + auVar187._8_8_;
      auVar215._0_8_ =
           local_ff0 +
           (double)local_1e20._16_8_ * (double)local_1e20._16_8_ +
           (double)local_1e20._448_8_ * (double)local_1e20._448_8_ +
           (double)local_1e20._880_8_ * (double)local_1e20._880_8_;
      auVar215._8_8_ =
           dStack_fe8 +
           (double)local_1e20._24_8_ * (double)local_1e20._24_8_ +
           (double)local_1e20._456_8_ * (double)local_1e20._456_8_ +
           (double)local_1e20._888_8_ * (double)local_1e20._888_8_;
      auVar238._0_8_ =
           (double)local_1e20._128_8_ * (double)local_1e20._128_8_ + auVar197._0_8_ + auVar200._0_8_
           + local_ff0;
      auVar238._8_8_ =
           (double)local_1e20._136_8_ * (double)local_1e20._136_8_ + auVar197._8_8_ + auVar200._8_8_
           + dStack_fe8;
      auVar189 = vmulpd_avx512vl(auVar220,auVar91);
      auVar190 = vmulpd_avx512vl(auVar215,auVar91);
      auVar191 = vmulpd_avx512vl(auVar205,auVar91);
      auVar193 = vmulpd_avx512vl(auVar225,auVar91);
      auVar197 = vmulpd_avx512vl(auVar228,auVar91);
      auVar200 = vmulpd_avx512vl(auVar231,auVar91);
      auVar192 = vmulpd_avx512vl(auVar233,auVar91);
      auVar195 = vmulpd_avx512vl(auVar236,auVar91);
      auVar194 = vmulpd_avx512vl(auVar238,auVar91);
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = this->m_Alpha;
      auVar187._8_8_ = 0;
      auVar187._0_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0];
      auVar187 = vmovddup_avx512vl(auVar187);
      auVar188._8_8_ = dStack_2248;
      auVar188._0_8_ = local_2250;
      auVar188 = vmulpd_avx512vl(auVar187,auVar188);
      local_1090 = auVar189._0_8_ + auVar188._0_8_;
      dStack_1088 = auVar189._8_8_ + auVar188._8_8_;
      auVar189._8_8_ = local_2240[1];
      auVar189._0_8_ = local_2240[0];
      auVar188 = vmulpd_avx512vl(auVar187,auVar189);
      local_1080[0] = auVar190._0_8_ + auVar188._0_8_;
      local_1080[1] = auVar190._8_8_ + auVar188._8_8_;
      auVar190._8_8_ = local_2240[3];
      auVar190._0_8_ = local_2240[2];
      auVar188 = vmulpd_avx512vl(auVar187,auVar190);
      local_1080[2] = auVar191._0_8_ + auVar188._0_8_;
      local_1080[3] = auVar191._8_8_ + auVar188._8_8_;
      auVar191._8_8_ = dStack_2218;
      auVar191._0_8_ = local_2220;
      auVar188 = vmulpd_avx512vl(auVar187,auVar191);
      local_1060 = auVar193._0_8_ + auVar188._0_8_;
      dStack_1058 = auVar193._8_8_ + auVar188._8_8_;
      auVar188 = vmulpd_avx512vl(auVar187,local_2210);
      local_1050 = auVar197._0_8_ + auVar188._0_8_;
      dStack_1048 = auVar197._8_8_ + auVar188._8_8_;
      auVar188 = vmulpd_avx512vl(auVar187,local_2200);
      local_1040 = auVar200._0_8_ + auVar188._0_8_;
      dStack_1038 = auVar200._8_8_ + auVar188._8_8_;
      auVar188 = vmulpd_avx512vl(auVar187,local_21f0);
      local_1030 = auVar192._0_8_ + auVar188._0_8_;
      dStack_1028 = auVar192._8_8_ + auVar188._8_8_;
      auVar188 = vmulpd_avx512vl(auVar187,local_21e0);
      local_1020 = auVar195._0_8_ + auVar188._0_8_;
      dStack_1018 = auVar195._8_8_ + auVar188._8_8_;
      auVar187 = vmulpd_avx512vl(auVar187,local_21d0);
      local_1010 = vaddpd_avx512vl(auVar194,auVar187);
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar1) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) {
LAB_00745bcf:
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, -1>, 18, 1>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 18, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_00745bfb;
      }
      pdVar182 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      auVar63._8_8_ = local_1e20._792_8_;
      auVar63._0_8_ = local_1e20._784_8_;
      auVar88._8_8_ = local_1e20._1256_8_;
      auVar88._0_8_ = local_1e20._1248_8_;
      dStack_1088 = dStack_1088 * (pdVar182 + local_1fa8 * 0x12)[1];
      local_1090 = local_1090 * pdVar182[local_1fa8 * 0x12];
      local_1080[1] = local_1080[1] * (pdVar182 + local_1fa8 * 0x12 + 2)[1];
      local_1080[0] = local_1080[0] * pdVar182[local_1fa8 * 0x12 + 2];
      local_1080[3] = local_1080[3] * (pdVar182 + local_1fa8 * 0x12 + 4)[1];
      local_1080[2] = local_1080[2] * pdVar182[local_1fa8 * 0x12 + 4];
      dStack_1058 = dStack_1058 * (pdVar182 + local_1fa8 * 0x12 + 6)[1];
      local_1060 = local_1060 * pdVar182[local_1fa8 * 0x12 + 6];
      dStack_1048 = dStack_1048 * (pdVar182 + local_1fa8 * 0x12 + 8)[1];
      local_1050 = local_1050 * pdVar182[local_1fa8 * 0x12 + 8];
      dStack_1038 = dStack_1038 * (pdVar182 + local_1fa8 * 0x12 + 10)[1];
      local_1040 = local_1040 * pdVar182[local_1fa8 * 0x12 + 10];
      dStack_1028 = dStack_1028 * (pdVar182 + local_1fa8 * 0x12 + 0xc)[1];
      local_1030 = local_1030 * pdVar182[local_1fa8 * 0x12 + 0xc];
      dStack_1018 = dStack_1018 * (pdVar182 + local_1fa8 * 0x12 + 0xe)[1];
      local_1020 = local_1020 * pdVar182[local_1fa8 * 0x12 + 0xe];
      dVar183 = local_1010._0_8_;
      local_1010._8_8_ = local_1010._8_8_ * (pdVar182 + local_1fa8 * 0x12 + 0x10)[1];
      local_1010._0_8_ = dVar183 * pdVar182[local_1fa8 * 0x12 + 0x10];
      auVar93._8_8_ = dStack_fe8;
      auVar93._0_8_ = local_ff0;
      auVar92._8_8_ = dStack_ff8;
      auVar92._0_8_ = local_1000;
      auVar54._8_8_ = local_1e20._648_8_;
      auVar54._0_8_ = local_1e20._640_8_;
      auVar187 = vmulpd_avx512vl(auVar54,local_1690);
      auVar245._0_8_ = (double)local_1e20._208_8_ * local_1840;
      auVar245._8_8_ = (double)local_1e20._216_8_ * dStack_1838;
      auVar90._8_8_ = local_1e20._1288_8_;
      auVar90._0_8_ = local_1e20._1280_8_;
      auVar187 = vaddpd_avx512vl(auVar245,auVar187);
      auVar76._8_8_ = local_1e20._1080_8_;
      auVar76._0_8_ = local_1e20._1072_8_;
      auVar188 = vmulpd_avx512vl(auVar76,local_14e0);
      auVar189 = vmulpd_avx512vl(auVar76,auVar76);
      local_1f80._8_8_ = local_1e20._312_8_;
      local_1f80._0_8_ = local_1e20._304_8_;
      auVar187 = vaddpd_avx512vl(auVar187,auVar188);
      auVar55._8_8_ = local_1e20._664_8_;
      auVar55._0_8_ = local_1e20._656_8_;
      auVar188 = vmulpd_avx512vl(auVar55,local_1680);
      auVar33._8_8_ = local_1e20._232_8_;
      auVar33._0_8_ = local_1e20._224_8_;
      auVar190 = vmulpd_avx512vl(auVar33,local_1830);
      auVar191 = vmulpd_avx512vl(auVar55,auVar55);
      auVar85._8_8_ = local_1e20._1208_8_;
      auVar85._0_8_ = local_1e20._1200_8_;
      auVar188 = vaddpd_avx512vl(auVar190,auVar188);
      auVar78._8_8_ = local_1e20._1096_8_;
      auVar78._0_8_ = local_1e20._1088_8_;
      auVar190 = vmulpd_avx512vl(auVar78,local_14d0);
      local_c70 = (double)local_1e20._352_8_;
      dStack_c68 = (double)local_1e20._360_8_;
      auVar193 = vmulpd_avx512vl(auVar78,auVar78);
      auVar39._8_8_ = local_1e20._328_8_;
      auVar39._0_8_ = local_1e20._320_8_;
      auVar188 = vaddpd_avx512vl(auVar188,auVar190);
      auVar57._8_8_ = local_1e20._680_8_;
      auVar57._0_8_ = local_1e20._672_8_;
      auVar190 = vmulpd_avx512vl(auVar57,local_1670);
      auVar34._8_8_ = local_1e20._248_8_;
      auVar34._0_8_ = local_1e20._240_8_;
      auVar197 = vmulpd_avx512vl(auVar34,local_1820);
      auVar200 = vmulpd_avx512vl(auVar57,auVar57);
      auVar84._8_8_ = local_1e20._1192_8_;
      auVar84._0_8_ = local_1e20._1184_8_;
      auVar192 = vmulpd_avx512vl(auVar34,auVar34);
      auVar60._8_8_ = local_1e20._744_8_;
      auVar60._0_8_ = local_1e20._736_8_;
      auVar190 = vaddpd_avx512vl(auVar197,auVar190);
      auVar79._8_8_ = local_1e20._1112_8_;
      auVar79._0_8_ = local_1e20._1104_8_;
      auVar197 = vmulpd_avx512vl(auVar79,local_14c0);
      auVar195 = vmulpd_avx512vl(auVar79,auVar79);
      auVar67._8_8_ = local_1e20._856_8_;
      auVar67._0_8_ = local_1e20._848_8_;
      auVar190 = vaddpd_avx512vl(auVar190,auVar197);
      auVar58._8_8_ = local_1e20._696_8_;
      auVar58._0_8_ = local_1e20._688_8_;
      auVar197 = vmulpd_avx512vl(auVar58,local_1660);
      auVar35._8_8_ = local_1e20._264_8_;
      auVar35._0_8_ = local_1e20._256_8_;
      auVar194 = vmulpd_avx512vl(auVar35,local_1810);
      auVar198 = vmulpd_avx512vl(auVar58,auVar58);
      auVar43._8_8_ = local_1e20._408_8_;
      auVar43._0_8_ = local_1e20._400_8_;
      auVar201 = vmulpd_avx512vl(auVar35,auVar35);
      auVar66._8_8_ = local_1e20._840_8_;
      auVar66._0_8_ = local_1e20._832_8_;
      auVar197 = vaddpd_avx512vl(auVar194,auVar197);
      auVar80._8_8_ = local_1e20._1128_8_;
      auVar80._0_8_ = local_1e20._1120_8_;
      auVar194 = vmulpd_avx512vl(auVar80,local_14b0);
      auVar196 = vmulpd_avx512vl(auVar80,auVar80);
      auVar86._8_8_ = local_1e20._1224_8_;
      auVar86._0_8_ = local_1e20._1216_8_;
      auVar197 = vaddpd_avx512vl(auVar197,auVar194);
      auVar59._8_8_ = local_1e20._712_8_;
      auVar59._0_8_ = local_1e20._704_8_;
      auVar194 = vmulpd_avx512vl(auVar59,local_1650);
      auVar37._8_8_ = local_1e20._280_8_;
      auVar37._0_8_ = local_1e20._272_8_;
      auVar199 = vmulpd_avx512vl(auVar37,local_1800);
      auVar202 = vmulpd_avx512vl(auVar59,auVar59);
      auVar40._8_8_ = local_1e20._344_8_;
      auVar40._0_8_ = local_1e20._336_8_;
      auVar203 = vmulpd_avx512vl(auVar37,auVar37);
      auVar44._8_8_ = local_1e20._424_8_;
      auVar44._0_8_ = local_1e20._416_8_;
      auVar194 = vaddpd_avx512vl(auVar199,auVar194);
      auVar82._8_8_ = local_1e20._1144_8_;
      auVar82._0_8_ = local_1e20._1136_8_;
      auVar199 = vmulpd_avx512vl(auVar82,local_14a0);
      auVar204 = vmulpd_avx512vl(auVar82,auVar82);
      auVar61._8_8_ = local_1e20._760_8_;
      auVar61._0_8_ = local_1e20._752_8_;
      auVar194 = vaddpd_avx512vl(auVar194,auVar199);
      auVar62._8_8_ = local_1e20._776_8_;
      auVar62._0_8_ = local_1e20._768_8_;
      auVar83._8_8_ = local_1e20._1176_8_;
      auVar83._0_8_ = local_1e20._1168_8_;
      local_2210._0_8_ = auVar187._0_8_;
      local_2210._8_8_ = auVar187._8_8_;
      local_2200._0_8_ = auVar188._0_8_;
      local_2200._8_8_ = auVar188._8_8_;
      local_21f0._0_8_ = auVar190._0_8_;
      local_21f0._8_8_ = auVar190._8_8_;
      local_21e0._0_8_ = auVar197._0_8_;
      local_21e0._8_8_ = auVar197._8_8_;
      auVar89._8_8_ = local_1e20._1272_8_;
      auVar89._0_8_ = local_1e20._1264_8_;
      local_21d0._0_8_ = auVar194._0_8_;
      local_21d0._8_8_ = auVar194._8_8_;
      auVar65._8_8_ = local_1e20._824_8_;
      auVar65._0_8_ = local_1e20._816_8_;
      local_1120 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] *
                    ((double)local_1e20._144_8_ * local_1880 +
                     (double)local_1e20._576_8_ * local_16d0 +
                    (double)local_1e20._1008_8_ * local_1520) +
                   local_1000 *
                   (local_ff0 +
                   (double)local_1e20._144_8_ * (double)local_1e20._144_8_ +
                   (double)local_1e20._576_8_ * (double)local_1e20._576_8_ +
                   (double)local_1e20._1008_8_ * (double)local_1e20._1008_8_)) *
                   pdVar182[local_1fa8 * 0x12];
      dStack_1118 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                     m_storage.m_data.array[0] *
                     ((double)local_1e20._152_8_ * dStack_1878 +
                      (double)local_1e20._584_8_ * dStack_16c8 +
                     (double)local_1e20._1016_8_ * dStack_1518) +
                    dStack_ff8 *
                    (dStack_fe8 +
                    (double)local_1e20._152_8_ * (double)local_1e20._152_8_ +
                    (double)local_1e20._584_8_ * (double)local_1e20._584_8_ +
                    (double)local_1e20._1016_8_ * (double)local_1e20._1016_8_)) *
                    (pdVar182 + local_1fa8 * 0x12)[1];
      local_1fa0 = (double)local_1e20._720_8_;
      dStack_1f98 = (double)local_1e20._728_8_;
      local_1110[0] =
           (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.
            m_data.array[0] *
            ((double)local_1e20._1024_8_ * local_1510[0] +
            (double)local_1e20._160_8_ * local_1870[0] + (double)local_1e20._592_8_ * local_16c0[0])
           + local_1000 *
             (local_ff0 +
             (double)local_1e20._160_8_ * (double)local_1e20._160_8_ +
             (double)local_1e20._592_8_ * (double)local_1e20._592_8_ +
             (double)local_1e20._1024_8_ * (double)local_1e20._1024_8_)) *
           pdVar182[local_1fa8 * 0x12 + 2];
      local_1110[1] =
           (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.
            m_data.array[0] *
            ((double)local_1e20._1032_8_ * local_1510[1] +
            (double)local_1e20._168_8_ * local_1870[1] + (double)local_1e20._600_8_ * local_16c0[1])
           + dStack_ff8 *
             (dStack_fe8 +
             (double)local_1e20._168_8_ * (double)local_1e20._168_8_ +
             (double)local_1e20._600_8_ * (double)local_1e20._600_8_ +
             (double)local_1e20._1032_8_ * (double)local_1e20._1032_8_)) *
           (pdVar182 + local_1fa8 * 0x12 + 2)[1];
      local_1110[2] =
           (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.
            m_data.array[0] *
            ((double)local_1e20._176_8_ * local_1870[2] + (double)local_1e20._608_8_ * local_16c0[2]
            + (double)local_1e20._1040_8_ * local_1510[2]) +
           local_1000 *
           (local_ff0 +
           (double)local_1e20._176_8_ * (double)local_1e20._176_8_ +
           (double)local_1e20._608_8_ * (double)local_1e20._608_8_ +
           (double)local_1e20._1040_8_ * (double)local_1e20._1040_8_)) *
           pdVar182[local_1fa8 * 0x12 + 4];
      local_1110[3] =
           (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.
            m_data.array[0] *
            ((double)local_1e20._184_8_ * local_1870[3] + (double)local_1e20._616_8_ * local_16c0[3]
            + (double)local_1e20._1048_8_ * local_1510[3]) +
           dStack_ff8 *
           (dStack_fe8 +
           (double)local_1e20._184_8_ * (double)local_1e20._184_8_ +
           (double)local_1e20._616_8_ * (double)local_1e20._616_8_ +
           (double)local_1e20._1048_8_ * (double)local_1e20._1048_8_)) *
           (pdVar182 + local_1fa8 * 0x12 + 4)[1];
      local_1f90._0_8_ = local_1e20._1152_8_;
      local_1f90._8_8_ = local_1e20._1160_8_;
      local_10f0 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] *
                    ((double)local_1e20._192_8_ * local_1850 +
                     (double)local_1e20._624_8_ * local_16a0 +
                    (double)local_1e20._1056_8_ * local_14f0) +
                   local_1000 *
                   (local_ff0 +
                   (double)local_1e20._192_8_ * (double)local_1e20._192_8_ +
                   (double)local_1e20._624_8_ * (double)local_1e20._624_8_ +
                   (double)local_1e20._1056_8_ * (double)local_1e20._1056_8_)) *
                   pdVar182[local_1fa8 * 0x12 + 6];
      dStack_10e8 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                     m_storage.m_data.array[0] *
                     ((double)local_1e20._200_8_ * dStack_1848 +
                      (double)local_1e20._632_8_ * dStack_1698 +
                     (double)local_1e20._1064_8_ * dStack_14e8) +
                    dStack_ff8 *
                    (dStack_fe8 +
                    (double)local_1e20._200_8_ * (double)local_1e20._200_8_ +
                    (double)local_1e20._632_8_ * (double)local_1e20._632_8_ +
                    (double)local_1e20._1064_8_ * (double)local_1e20._1064_8_)) *
                    (pdVar182 + local_1fa8 * 0x12 + 6)[1];
      auVar64._8_8_ = local_1e20._808_8_;
      auVar64._0_8_ = local_1e20._800_8_;
      local_10e0 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_2210._0_8_ +
                   local_1000 *
                   (local_ff0 +
                   (double)local_1e20._208_8_ * (double)local_1e20._208_8_ +
                   (double)local_1e20._640_8_ * (double)local_1e20._640_8_ + auVar189._0_8_)) *
                   pdVar182[local_1fa8 * 0x12 + 8];
      dStack_10d8 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                     m_storage.m_data.array[0] * (double)local_2210._8_8_ +
                    dStack_ff8 *
                    (dStack_fe8 +
                    (double)local_1e20._216_8_ * (double)local_1e20._216_8_ +
                    (double)local_1e20._648_8_ * (double)local_1e20._648_8_ + auVar189._8_8_)) *
                    (pdVar182 + local_1fa8 * 0x12 + 8)[1];
      auVar41._8_8_ = local_1e20._376_8_;
      auVar41._0_8_ = local_1e20._368_8_;
      local_10d0 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_2200._0_8_ +
                   local_1000 *
                   (local_ff0 +
                   (double)local_1e20._224_8_ * (double)local_1e20._224_8_ + auVar191._0_8_ +
                   auVar193._0_8_)) * pdVar182[local_1fa8 * 0x12 + 10];
      dStack_10c8 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                     m_storage.m_data.array[0] * (double)local_2200._8_8_ +
                    dStack_ff8 *
                    (dStack_fe8 +
                    (double)local_1e20._232_8_ * (double)local_1e20._232_8_ + auVar191._8_8_ +
                    auVar193._8_8_)) * (pdVar182 + local_1fa8 * 0x12 + 10)[1];
      auVar87._8_8_ = local_1e20._1240_8_;
      auVar87._0_8_ = local_1e20._1232_8_;
      local_10c0 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21f0._0_8_ +
                   local_1000 * (local_ff0 + auVar195._0_8_ + auVar200._0_8_ + auVar192._0_8_)) *
                   pdVar182[local_1fa8 * 0x12 + 0xc];
      dStack_10b8 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                     m_storage.m_data.array[0] * (double)local_21f0._8_8_ +
                    dStack_ff8 * (dStack_fe8 + auVar195._8_8_ + auVar200._8_8_ + auVar192._8_8_)) *
                    (pdVar182 + local_1fa8 * 0x12 + 0xc)[1];
      auVar42._8_8_ = local_1e20._392_8_;
      auVar42._0_8_ = local_1e20._384_8_;
      local_10b0 = ((auVar201._0_8_ + auVar198._0_8_ + auVar196._0_8_ + local_ff0) * local_1000 +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_21e0._0_8_) *
                   pdVar182[local_1fa8 * 0x12 + 0xe];
      dStack_10a8 = ((auVar201._8_8_ + auVar198._8_8_ + auVar196._8_8_ + dStack_fe8) * dStack_ff8 +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21e0._8_8_) *
                    (pdVar182 + local_1fa8 * 0x12 + 0xe)[1];
      local_10a0 = ((auVar203._0_8_ + auVar202._0_8_ + auVar204._0_8_ + local_ff0) * local_1000 +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_21d0._0_8_) *
                   pdVar182[local_1fa8 * 0x12 + 0x10];
      dStack_1098 = ((auVar203._8_8_ + auVar202._8_8_ + auVar204._8_8_ + dStack_fe8) * dStack_ff8 +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21d0._8_8_) *
                    (pdVar182 + local_1fa8 * 0x12 + 0x10)[1];
      local_2250 = (double)local_1e20._288_8_ * local_17f0 + (double)local_1e20._720_8_ * local_1640
                   + (double)local_1e20._1152_8_ * local_1490;
      dStack_2248 = (double)local_1e20._296_8_ * dStack_17e8 +
                    (double)local_1e20._728_8_ * dStack_1638 +
                    (double)local_1e20._1160_8_ * dStack_1488;
      auVar187 = vmulpd_avx512vl(auVar60,local_1630);
      auVar188 = vmulpd_avx512vl(local_1f80._0_16_,local_17e0);
      auVar189 = vmulpd_avx512vl(auVar83,local_1480);
      local_2240[0] = auVar188._0_8_ + auVar187._0_8_ + auVar189._0_8_;
      local_2240[1] = auVar188._8_8_ + auVar187._8_8_ + auVar189._8_8_;
      auVar187 = vmulpd_avx512vl(auVar61,local_1620);
      auVar188 = vmulpd_avx512vl(auVar39,local_17d0);
      auVar189 = vmulpd_avx512vl(auVar84,local_1470);
      local_2240[2] = auVar188._0_8_ + auVar187._0_8_ + auVar189._0_8_;
      local_2240[3] = auVar188._8_8_ + auVar187._8_8_ + auVar189._8_8_;
      auVar187 = vmulpd_avx512vl(auVar62,local_1610);
      auVar188 = vmulpd_avx512vl(auVar40,local_17c0);
      auVar189 = vmulpd_avx512vl(auVar85,local_1460);
      local_2220 = auVar188._0_8_ + auVar187._0_8_ + auVar189._0_8_;
      dStack_2218 = auVar188._8_8_ + auVar187._8_8_ + auVar189._8_8_;
      auVar187 = vmulpd_avx512vl(auVar63,local_1600);
      auVar188 = vmulpd_avx512vl(auVar86,local_1450);
      local_2210._0_8_ = (double)local_1e20._352_8_ * local_17b0 + auVar187._0_8_ + auVar188._0_8_;
      local_2210._8_8_ = (double)local_1e20._360_8_ * dStack_17a8 + auVar187._8_8_ + auVar188._8_8_;
      local_2200._0_8_ =
           (double)local_1e20._368_8_ * local_17a0 + (double)local_1e20._800_8_ * local_15f0 +
           (double)local_1e20._1232_8_ * local_1440;
      local_2200._8_8_ =
           (double)local_1e20._376_8_ * dStack_1798 + (double)local_1e20._808_8_ * dStack_15e8 +
           (double)local_1e20._1240_8_ * dStack_1438;
      auVar187 = vmulpd_avx512vl(auVar88,local_1430);
      local_21f0._0_8_ =
           (double)local_1e20._384_8_ * local_1790 + (double)local_1e20._816_8_ * local_15e0 +
           auVar187._0_8_;
      local_21f0._8_8_ =
           (double)local_1e20._392_8_ * dStack_1788 + (double)local_1e20._824_8_ * dStack_15d8 +
           auVar187._8_8_;
      auVar187 = vmulpd_avx512vl(auVar66,local_15d0);
      auVar188 = vmulpd_avx512vl(auVar43,local_1780);
      local_21e0._0_8_ = auVar188._0_8_ + auVar187._0_8_ + (double)local_1e20._1264_8_ * local_1420;
      local_21e0._8_8_ = auVar188._8_8_ + auVar187._8_8_ + (double)local_1e20._1272_8_ * dStack_1418
      ;
      auVar187 = vmulpd_avx512vl(auVar67,local_15c0);
      auVar188 = vmulpd_avx512vl(auVar44,local_1770);
      local_21d0._0_8_ = auVar188._0_8_ + auVar187._0_8_ + (double)local_1e20._1280_8_ * local_1410;
      local_21d0._8_8_ = auVar188._8_8_ + auVar187._8_8_ + (double)local_1e20._1288_8_ * dStack_1408
      ;
      auVar187 = vmulpd_avx512vl(auVar60,auVar60);
      auVar188 = vmulpd_avx512vl(auVar61,auVar61);
      auVar189 = vmulpd_avx512vl(auVar62,auVar62);
      auVar190 = vmulpd_avx512vl(local_1f80._0_16_,local_1f80._0_16_);
      auVar191 = vmulpd_avx512vl(auVar83,auVar83);
      auVar193 = vmulpd_avx512vl(auVar63,auVar63);
      auVar197 = vmulpd_avx512vl(auVar66,auVar66);
      auVar200 = vmulpd_avx512vl(auVar39,auVar39);
      auVar192 = vmulpd_avx512vl(auVar64,auVar64);
      auVar206._0_8_ =
           local_1000 *
           (local_ff0 +
           (double)local_1e20._288_8_ * (double)local_1e20._288_8_ +
           (double)local_1e20._720_8_ * (double)local_1e20._720_8_ +
           (double)local_1e20._1152_8_ * (double)local_1e20._1152_8_);
      auVar206._8_8_ =
           dStack_ff8 *
           (dStack_fe8 +
           (double)local_1e20._296_8_ * (double)local_1e20._296_8_ +
           (double)local_1e20._728_8_ * (double)local_1e20._728_8_ +
           (double)local_1e20._1160_8_ * (double)local_1e20._1160_8_);
      auVar195 = vmulpd_avx512vl(auVar84,auVar84);
      auVar194 = vmulpd_avx512vl(auVar40,auVar40);
      auVar198 = vmulpd_avx512vl(auVar65,auVar65);
      auVar216._0_8_ = local_1000 * (local_ff0 + auVar190._0_8_ + auVar187._0_8_ + auVar191._0_8_);
      auVar216._8_8_ = dStack_ff8 * (dStack_fe8 + auVar190._8_8_ + auVar187._8_8_ + auVar191._8_8_);
      auVar187 = vmulpd_avx512vl(auVar85,auVar85);
      auVar229._0_8_ = (double)local_1e20._352_8_ * (double)local_1e20._352_8_;
      auVar229._8_8_ = (double)local_1e20._360_8_ * (double)local_1e20._360_8_;
      auVar221._0_8_ = local_1000 * (local_ff0 + auVar200._0_8_ + auVar188._0_8_ + auVar195._0_8_);
      auVar221._8_8_ = dStack_ff8 * (dStack_fe8 + auVar200._8_8_ + auVar188._8_8_ + auVar195._8_8_);
      auVar188 = vaddpd_avx512vl(auVar229,auVar193);
      auVar190 = vmulpd_avx512vl(auVar86,auVar86);
      auVar188 = vaddpd_avx512vl(auVar188,auVar190);
      auVar190 = vmulpd_avx512vl(auVar41,auVar41);
      auVar226._0_8_ = local_1000 * (local_ff0 + auVar194._0_8_ + auVar189._0_8_ + auVar187._0_8_);
      auVar226._8_8_ = dStack_ff8 * (dStack_fe8 + auVar194._8_8_ + auVar189._8_8_ + auVar187._8_8_);
      auVar187 = vaddpd_avx512vl(auVar190,auVar192);
      auVar189 = vmulpd_avx512vl(auVar87,auVar87);
      auVar187 = vaddpd_avx512vl(auVar187,auVar189);
      auVar189 = vmulpd_avx512vl(auVar42,auVar42);
      auVar189 = vaddpd_avx512vl(auVar189,auVar198);
      auVar190 = vmulpd_avx512vl(auVar88,auVar88);
      auVar191 = vmulpd_avx512vl(auVar67,auVar67);
      auVar187 = vaddpd_avx512vl(auVar187,auVar93);
      auVar189 = vaddpd_avx512vl(auVar189,auVar190);
      auVar190 = vmulpd_avx512vl(auVar43,auVar43);
      auVar187 = vmulpd_avx512vl(auVar187,auVar92);
      auVar190 = vaddpd_avx512vl(auVar190,auVar197);
      auVar193 = vmulpd_avx512vl(auVar89,auVar89);
      auVar189 = vaddpd_avx512vl(auVar189,auVar93);
      auVar190 = vaddpd_avx512vl(auVar190,auVar193);
      auVar193 = vmulpd_avx512vl(auVar44,auVar44);
      auVar189 = vmulpd_avx512vl(auVar189,auVar92);
      auVar191 = vaddpd_avx512vl(auVar193,auVar191);
      auVar193 = vmulpd_avx512vl(auVar90,auVar90);
      auVar190 = vaddpd_avx512vl(auVar190,auVar93);
      auVar191 = vaddpd_avx512vl(auVar191,auVar193);
      auVar190 = vmulpd_avx512vl(auVar190,auVar92);
      auVar191 = vaddpd_avx512vl(auVar191,auVar93);
      auVar191 = vmulpd_avx512vl(auVar191,auVar92);
      dVar183 = this->m_Alpha;
      auVar247._8_8_ = 0;
      auVar247._0_8_ = dVar183;
      vmovsd_avx512f(auVar247);
      auVar240._8_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0];
      auVar240._0_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0];
      auVar16._8_8_ = dStack_2248;
      auVar16._0_8_ = local_2250;
      auVar193 = vmulpd_avx512vl(auVar240,auVar16);
      local_11b0 = vaddpd_avx512vl(auVar206,auVar193);
      auVar207._0_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2240[0];
      auVar207._8_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2240[1];
      local_11a0 = vaddpd_avx512vl(auVar216,auVar207);
      auVar208._0_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2240[2];
      auVar208._8_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2240[3];
      local_1190 = vaddpd_avx512vl(auVar221,auVar208);
      auVar209._0_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2220;
      auVar209._8_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * dStack_2218;
      local_1180 = vaddpd_avx512vl(auVar226,auVar209);
      local_1170 = local_1000 * (local_ff0 + auVar188._0_8_) +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_2210._0_8_;
      dStack_1168 = dStack_ff8 * (dStack_fe8 + auVar188._8_8_) +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_2210._8_8_;
      local_1160 = auVar187._0_8_ +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_2200._0_8_;
      dStack_1158 = auVar187._8_8_ +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_2200._8_8_;
      local_1150 = auVar189._0_8_ +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_21f0._0_8_;
      dStack_1148 = auVar189._8_8_ +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21f0._8_8_;
      local_1140 = auVar190._0_8_ +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_21e0._0_8_;
      dStack_1138 = auVar190._8_8_ +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21e0._8_8_;
      local_1130 = auVar191._0_8_ +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_21d0._0_8_;
      dStack_1128 = auVar191._8_8_ +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21d0._8_8_;
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar1) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00745bcf;
      pdVar182 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      uVar184 = 0xfffffffffffffffe;
      local_11b0 = vmulpd_avx512vl(local_11b0,*(undefined1 (*) [16])(pdVar182 + local_1fa8 * 0x12));
      local_11a0 = vmulpd_avx512vl(local_11a0,
                                   *(undefined1 (*) [16])(pdVar182 + local_1fa8 * 0x12 + 2));
      local_1190 = vmulpd_avx512vl(local_1190,
                                   *(undefined1 (*) [16])(pdVar182 + local_1fa8 * 0x12 + 4));
      local_1180 = vmulpd_avx512vl(local_1180,
                                   *(undefined1 (*) [16])(pdVar182 + local_1fa8 * 0x12 + 6));
      local_1170 = local_1170 * pdVar182[local_1fa8 * 0x12 + 8];
      dStack_1168 = dStack_1168 * (pdVar182 + local_1fa8 * 0x12 + 8)[1];
      dStack_1158 = dStack_1158 * (pdVar182 + local_1fa8 * 0x12 + 10)[1];
      local_1160 = local_1160 * pdVar182[local_1fa8 * 0x12 + 10];
      dStack_1148 = dStack_1148 * (pdVar182 + local_1fa8 * 0x12 + 0xc)[1];
      local_1150 = local_1150 * pdVar182[local_1fa8 * 0x12 + 0xc];
      dStack_1138 = dStack_1138 * (pdVar182 + local_1fa8 * 0x12 + 0xe)[1];
      local_1140 = local_1140 * pdVar182[local_1fa8 * 0x12 + 0xe];
      dStack_1128 = dStack_1128 * (pdVar182 + local_1fa8 * 0x12 + 0x10)[1];
      local_1130 = local_1130 * pdVar182[local_1fa8 * 0x12 + 0x10];
      do {
        dVar4 = *(double *)(local_1e20 + uVar184 * 8 + 0x138);
        dVar5 = *(double *)(local_18a0 + uVar184 * 8 + -0x298);
        dVar6 = *(double *)(local_1e20 + uVar184 * 8 + 0xa8);
        dVar7 = *(double *)(local_1e20 + uVar184 * 8 + 600);
        dVar8 = local_1870[uVar184 + 1];
        dVar9 = local_16c0[uVar184 + 1];
        dVar10 = *(double *)(local_17e0 + uVar184 * 8 + 8);
        dVar11 = *(double *)(local_18a0 + uVar184 * 8 + -0xe8);
        dVar12 = local_1510[uVar184 + 1];
        dVar13 = *(double *)(local_1630 + uVar184 * 8 + 8);
        dVar14 = *(double *)(local_18a0 + uVar184 * 8 + -0x178);
        dVar15 = *(double *)(local_1480 + uVar184 * 8 + 8);
        local_2240[uVar184] =
             *(double *)(local_1e20 + uVar184 * 8 + 0x130) * local_1870[uVar184] +
             *(double *)(local_18a0 + uVar184 * 8 + -0x2a0) * local_16c0[uVar184] +
             *(double *)(local_18a0 + uVar184 * 8 + -0xf0) * local_1510[uVar184] +
             *(double *)(local_1e20 + uVar184 * 8 + 0xa0) * *(double *)(local_17e0 + uVar184 * 8) +
             *(double *)(local_1e20 + uVar184 * 8 + 0x250) * *(double *)(local_1630 + uVar184 * 8) +
             *(double *)(local_18a0 + uVar184 * 8 + -0x180) * *(double *)(local_1480 + uVar184 * 8);
        local_2240[uVar184 + 1] =
             dVar4 * dVar8 + dVar5 * dVar9 + dVar11 * dVar12 + dVar6 * dVar10 + dVar7 * dVar13 +
             dVar14 * dVar15;
        uVar174 = local_1e20._1096_8_;
        uVar173 = local_1e20._1088_8_;
        uVar172 = local_1e20._1080_8_;
        uVar171 = local_1e20._1072_8_;
        uVar170 = local_1e20._1064_8_;
        uVar169 = local_1e20._1056_8_;
        uVar168 = local_1e20._1048_8_;
        uVar167 = local_1e20._1040_8_;
        uVar166 = local_1e20._1032_8_;
        uVar165 = local_1e20._1024_8_;
        uVar164 = local_1e20._1016_8_;
        uVar163 = local_1e20._1008_8_;
        uVar146 = local_1e20._648_8_;
        uVar145 = local_1e20._640_8_;
        uVar144 = local_1e20._632_8_;
        uVar143 = local_1e20._624_8_;
        uVar142 = local_1e20._616_8_;
        uVar141 = local_1e20._608_8_;
        uVar140 = local_1e20._600_8_;
        uVar139 = local_1e20._592_8_;
        uVar138 = local_1e20._584_8_;
        uVar137 = local_1e20._576_8_;
        uVar118 = local_1e20._248_8_;
        uVar117 = local_1e20._240_8_;
        uVar116 = local_1e20._232_8_;
        uVar115 = local_1e20._224_8_;
        uVar114 = local_1e20._200_8_;
        uVar113 = local_1e20._192_8_;
        uVar112 = local_1e20._184_8_;
        uVar111 = local_1e20._176_8_;
        uVar110 = local_1e20._168_8_;
        uVar109 = local_1e20._160_8_;
        uVar108 = local_1e20._152_8_;
        uVar107 = local_1e20._144_8_;
        auVar187 = local_1f80._0_16_;
        uVar184 = uVar184 + 2;
      } while (uVar184 < 0x10);
      auVar30._8_8_ = local_1e20._168_8_;
      auVar30._0_8_ = local_1e20._160_8_;
      auVar31._8_8_ = local_1e20._200_8_;
      auVar31._0_8_ = local_1e20._192_8_;
      auVar56._8_8_ = local_1e20._664_8_;
      auVar56._0_8_ = local_1e20._656_8_;
      auVar248._8_8_ = 0;
      auVar248._0_8_ = dVar183;
      vmovsd_avx512f(auVar248);
      uVar184 = 0xfffffffffffffffe;
      local_cf0 = (double)local_1e20._144_8_;
      dStack_ce8 = (double)local_1e20._152_8_;
      local_d00 = (double)local_1e20._576_8_;
      dStack_cf8 = (double)local_1e20._584_8_;
      local_cd0 = (double)local_1e20._176_8_;
      dStack_cc8 = (double)local_1e20._184_8_;
      auVar188 = vmulpd_avx512vl(auVar64,auVar56);
      local_d70 = (double)local_1e20._240_8_;
      dStack_d68 = (double)local_1e20._248_8_;
      auVar210._0_8_ =
           (double)uVar119 * (double)local_1e20._144_8_ + local_1fa0 * (double)local_1e20._576_8_;
      auVar210._8_8_ =
           (double)uVar120 * (double)local_1e20._152_8_ + dStack_1f98 * (double)local_1e20._584_8_;
      local_d10 = (double)local_1e20._1008_8_;
      dStack_d08 = (double)local_1e20._1016_8_;
      auVar217._0_8_ = (double)local_1f90._0_8_ * (double)local_1e20._1008_8_;
      auVar217._8_8_ = (double)local_1f90._8_8_ * (double)local_1e20._1016_8_;
      auVar189 = vaddpd_avx512vl(auVar210,auVar217);
      auVar51._8_8_ = local_1e20._600_8_;
      auVar51._0_8_ = local_1e20._592_8_;
      auVar190 = vmulpd_avx512vl(local_1f80._0_16_,auVar30);
      auVar191 = vmulpd_avx512vl(auVar60,auVar51);
      local_da0 = (double)local_1e20._640_8_;
      dStack_d98 = (double)local_1e20._648_8_;
      auVar74._8_8_ = local_1e20._1032_8_;
      auVar74._0_8_ = local_1e20._1024_8_;
      auVar193 = vmulpd_avx512vl(auVar83,auVar74);
      auVar211._0_8_ = auVar190._0_8_ + auVar191._0_8_ + auVar193._0_8_;
      auVar211._8_8_ = auVar190._8_8_ + auVar191._8_8_ + auVar193._8_8_;
      auVar52._8_8_ = local_1e20._616_8_;
      auVar52._0_8_ = local_1e20._608_8_;
      auVar190 = vmulpd_avx512vl(auVar61,auVar52);
      local_d50 = (double)local_1e20._1040_8_;
      dStack_d48 = (double)local_1e20._1048_8_;
      auVar218._0_8_ =
           (double)uVar121 * (double)local_1e20._176_8_ + auVar190._0_8_ +
           (double)uVar175 * (double)local_1e20._1040_8_;
      auVar218._8_8_ =
           (double)uVar122 * (double)local_1e20._184_8_ + auVar190._8_8_ +
           (double)uVar176 * (double)local_1e20._1048_8_;
      auVar190 = vmulpd_avx512vl(auVar40,auVar31);
      auVar53._8_8_ = local_1e20._632_8_;
      auVar53._0_8_ = local_1e20._624_8_;
      auVar191 = vmulpd_avx512vl(auVar62,auVar53);
      auVar98._8_8_ = uVar102;
      auVar98._0_8_ = uVar101;
      auVar75._8_8_ = local_1e20._1064_8_;
      auVar75._0_8_ = local_1e20._1056_8_;
      auVar193 = vmulpd_avx512vl(auVar85,auVar75);
      auVar222._0_8_ = auVar190._0_8_ + auVar191._0_8_ + auVar193._0_8_;
      auVar222._8_8_ = auVar190._8_8_ + auVar191._8_8_ + auVar193._8_8_;
      auVar32._8_8_ = local_1e20._216_8_;
      auVar32._0_8_ = local_1e20._208_8_;
      auVar190 = vmulpd_avx512vl(auVar98,auVar32);
      auVar77._8_8_ = local_1e20._1080_8_;
      auVar77._0_8_ = local_1e20._1072_8_;
      auVar191 = vmulpd_avx512vl(auVar86,auVar77);
      auVar227._0_8_ =
           auVar190._0_8_ + (double)local_1e20._640_8_ * (double)uVar125 + auVar191._0_8_;
      auVar227._8_8_ =
           auVar190._8_8_ + (double)local_1e20._648_8_ * (double)uVar126 + auVar191._8_8_;
      local_dc0 = (double)local_1e20._224_8_;
      dStack_db8 = (double)local_1e20._232_8_;
      local_de0 = (double)local_1e20._1088_8_;
      dStack_dd8 = (double)local_1e20._1096_8_;
      auVar230._0_8_ =
           (double)local_1e20._224_8_ * (double)uVar103 + auVar188._0_8_ +
           (double)local_1e20._1088_8_ * (double)uVar129;
      auVar230._8_8_ =
           (double)local_1e20._232_8_ * (double)uVar104 + auVar188._8_8_ +
           (double)local_1e20._1096_8_ * (double)uVar130;
      auVar232._0_8_ =
           (double)local_1e20._240_8_ * (double)uVar105 +
           (double)uVar147 * (double)local_1e20._672_8_ +
           (double)uVar177 * (double)local_1e20._1104_8_;
      auVar232._8_8_ =
           (double)local_1e20._248_8_ * (double)uVar106 +
           (double)uVar148 * (double)local_1e20._680_8_ +
           (double)uVar178 * (double)local_1e20._1112_8_;
      auVar36._8_8_ = local_1e20._264_8_;
      auVar36._0_8_ = local_1e20._256_8_;
      auVar188 = vmulpd_avx512vl(auVar43,auVar36);
      auVar81._8_8_ = local_1e20._1128_8_;
      auVar81._0_8_ = local_1e20._1120_8_;
      auVar190 = vmulpd_avx512vl(auVar89,auVar81);
      auVar234._0_8_ =
           auVar188._0_8_ + (double)uVar149 * (double)local_1e20._688_8_ + auVar190._0_8_;
      auVar234._8_8_ =
           auVar188._8_8_ + (double)uVar150 * (double)local_1e20._696_8_ + auVar190._8_8_;
      auVar38._8_8_ = local_1e20._280_8_;
      auVar38._0_8_ = local_1e20._272_8_;
      auVar188 = vmulpd_avx512vl(auVar44,auVar38);
      auVar239._8_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0];
      auVar239._0_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0];
      auVar241._0_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2250;
      auVar241._8_8_ =
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * dStack_2248;
      auVar189 = vaddpd_avx512vl(auVar189,auVar241);
      auVar18._8_8_ = local_2240[1];
      auVar18._0_8_ = local_2240[0];
      auVar190 = vmulpd_avx512vl(auVar239,auVar18);
      auVar190 = vaddpd_avx512vl(auVar211,auVar190);
      auVar20._8_8_ = local_2240[3];
      auVar20._0_8_ = local_2240[2];
      auVar191 = vmulpd_avx512vl(auVar239,auVar20);
      auVar191 = vaddpd_avx512vl(auVar218,auVar191);
      auVar22._8_8_ = dStack_2218;
      auVar22._0_8_ = local_2220;
      auVar193 = vmulpd_avx512vl(auVar239,auVar22);
      auVar193 = vaddpd_avx512vl(auVar222,auVar193);
      auVar197 = vmulpd_avx512vl(auVar239,local_2210);
      auVar197 = vaddpd_avx512vl(auVar227,auVar197);
      auVar200 = vmulpd_avx512vl(auVar239,local_2200);
      auVar200 = vaddpd_avx512vl(auVar230,auVar200);
      auVar192 = vmulpd_avx512vl(auVar239,local_21f0);
      auVar192 = vaddpd_avx512vl(auVar232,auVar192);
      auVar195 = vmulpd_avx512vl(auVar239,local_21e0);
      auVar195 = vaddpd_avx512vl(auVar234,auVar195);
      dStack_1238 = auVar189._8_8_ * (pdVar182 + uVar179 * 0x12)[1];
      local_1240 = auVar189._0_8_ * pdVar182[uVar179 * 0x12];
      local_1230[1] = auVar190._8_8_ * (pdVar182 + uVar179 * 0x12 + 2)[1];
      local_1230[0] = auVar190._0_8_ * pdVar182[uVar179 * 0x12 + 2];
      local_1230[3] = auVar191._8_8_ * (pdVar182 + uVar179 * 0x12 + 4)[1];
      local_1230[2] = auVar191._0_8_ * pdVar182[uVar179 * 0x12 + 4];
      dStack_1208 = auVar193._8_8_ * (pdVar182 + uVar179 * 0x12 + 6)[1];
      local_1210 = auVar193._0_8_ * pdVar182[uVar179 * 0x12 + 6];
      dStack_11f8 = auVar197._8_8_ * (pdVar182 + uVar179 * 0x12 + 8)[1];
      local_1200 = auVar197._0_8_ * pdVar182[uVar179 * 0x12 + 8];
      dStack_11e8 = auVar200._8_8_ * (pdVar182 + uVar179 * 0x12 + 10)[1];
      local_11f0 = auVar200._0_8_ * pdVar182[uVar179 * 0x12 + 10];
      dStack_11d8 = auVar192._8_8_ * (pdVar182 + uVar179 * 0x12 + 0xc)[1];
      local_11e0 = auVar192._0_8_ * pdVar182[uVar179 * 0x12 + 0xc];
      dStack_11c8 = auVar195._8_8_ * (pdVar182 + uVar179 * 0x12 + 0xe)[1];
      local_11d0 = auVar195._0_8_ * pdVar182[uVar179 * 0x12 + 0xe];
      local_11c0 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21d0._0_8_ +
                   (double)uVar131 * (double)local_1e20._1136_8_ +
                   (double)uVar127 * (double)local_1e20._704_8_ + auVar188._0_8_) *
                   pdVar182[uVar179 * 0x12 + 0x10];
      dStack_11b8 = (local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                     m_storage.m_data.array[0] * (double)local_21d0._8_8_ +
                    (double)uVar132 * (double)local_1e20._1144_8_ +
                    (double)uVar128 * (double)local_1e20._712_8_ + auVar188._8_8_) *
                    (pdVar182 + uVar179 * 0x12 + 0x10)[1];
      do {
        dVar183 = *(double *)(local_1e20 + uVar184 * 8 + 0x138);
        dVar4 = *(double *)(local_18a0 + uVar184 * 8 + -0x298);
        dVar5 = *(double *)(local_1e20 + uVar184 * 8 + 0x18);
        dVar6 = *(double *)(local_1e20 + uVar184 * 8 + 0x1c8);
        dVar7 = *(double *)(local_18a0 + uVar184 * 8 + -0x58);
        dVar8 = local_1750[uVar184 + 1];
        dVar9 = *(double *)(local_17e0 + uVar184 * 8 + 8);
        dVar10 = *(double *)(local_18a0 + uVar184 * 8 + -0xe8);
        dVar11 = local_15a0[uVar184 + 1];
        dVar12 = *(double *)(local_1630 + uVar184 * 8 + 8);
        dVar13 = *(double *)(local_18a0 + uVar184 * 8 + -0x208);
        dVar14 = *(double *)(local_1480 + uVar184 * 8 + 8);
        local_2240[uVar184] =
             *(double *)(local_1e20 + uVar184 * 8 + 0x130) *
             *(double *)(local_18a0 + uVar184 * 8 + -0x60) +
             *(double *)(local_18a0 + uVar184 * 8 + -0x2a0) * local_1750[uVar184] +
             *(double *)(local_18a0 + uVar184 * 8 + -0xf0) * local_15a0[uVar184] +
             *(double *)(local_1e20 + uVar184 * 8 + 0x10) * *(double *)(local_17e0 + uVar184 * 8) +
             *(double *)(local_1e20 + uVar184 * 8 + 0x1c0) * *(double *)(local_1630 + uVar184 * 8) +
             *(double *)(local_18a0 + uVar184 * 8 + -0x210) * *(double *)(local_1480 + uVar184 * 8);
        local_2240[uVar184 + 1] =
             dVar183 * dVar7 + dVar4 * dVar8 + dVar10 * dVar11 + dVar5 * dVar9 + dVar6 * dVar12 +
             dVar13 * dVar14;
        uVar162 = local_1e20._1000_8_;
        uVar161 = local_1e20._992_8_;
        uVar160 = local_1e20._984_8_;
        uVar159 = local_1e20._976_8_;
        uVar158 = local_1e20._936_8_;
        uVar157 = local_1e20._928_8_;
        uVar156 = local_1e20._920_8_;
        uVar155 = local_1e20._912_8_;
        uVar154 = local_1e20._904_8_;
        uVar153 = local_1e20._896_8_;
        uVar152 = local_1e20._888_8_;
        uVar151 = local_1e20._880_8_;
        uVar136 = local_1e20._568_8_;
        uVar135 = local_1e20._560_8_;
        uVar134 = local_1e20._552_8_;
        uVar133 = local_1e20._544_8_;
        uVar132 = local_1e20._488_8_;
        uVar131 = local_1e20._480_8_;
        uVar130 = local_1e20._472_8_;
        uVar129 = local_1e20._464_8_;
        uVar128 = local_1e20._456_8_;
        uVar127 = local_1e20._448_8_;
        uVar126 = local_1e20._440_8_;
        uVar125 = local_1e20._432_8_;
        uVar106 = local_1e20._136_8_;
        uVar105 = local_1e20._128_8_;
        uVar104 = local_1e20._56_8_;
        uVar103 = local_1e20._48_8_;
        uVar102 = local_1e20._8_8_;
        uVar101 = local_1e20._0_8_;
        uVar184 = uVar184 + 2;
      } while (uVar184 < 0x10);
      auVar24._8_8_ = local_1e20._24_8_;
      auVar24._0_8_ = local_1e20._16_8_;
      auVar46._8_8_ = local_1e20._472_8_;
      auVar46._0_8_ = local_1e20._464_8_;
      auVar47._8_8_ = local_1e20._488_8_;
      auVar47._0_8_ = local_1e20._480_8_;
      auVar49._8_8_ = local_1e20._520_8_;
      auVar49._0_8_ = local_1e20._512_8_;
      auVar72._8_8_ = local_1e20._984_8_;
      auVar72._0_8_ = local_1e20._976_8_;
      vmovsd_avx512f(auVar248);
      local_df0 = (double)local_1e20._0_8_;
      dStack_de8 = (double)local_1e20._8_8_;
      local_e00 = (double)local_1e20._432_8_;
      dStack_df8 = (double)local_1e20._440_8_;
      auVar70._8_8_ = local_1e20._936_8_;
      auVar70._0_8_ = local_1e20._928_8_;
      local_1f80._0_8_ = local_1e20._32_8_;
      local_1f80._8_8_ = local_1e20._40_8_;
      auVar212._0_8_ =
           (double)uVar119 * (double)local_1e20._0_8_ + local_1fa0 * (double)local_1e20._432_8_;
      auVar212._8_8_ =
           (double)uVar120 * (double)local_1e20._8_8_ + dStack_1f98 * (double)local_1e20._440_8_;
      auVar223._0_8_ = (double)local_1f90._0_8_ * (double)local_1e20._864_8_;
      auVar223._8_8_ = (double)local_1f90._8_8_ * (double)local_1e20._872_8_;
      local_1fa0 = (double)local_1e20._864_8_;
      dStack_1f98 = (double)local_1e20._872_8_;
      auVar45._8_8_ = local_1e20._456_8_;
      auVar45._0_8_ = local_1e20._448_8_;
      auVar188 = vaddpd_avx512vl(auVar212,auVar223);
      auVar187 = vmulpd_avx512vl(auVar187,auVar24);
      auVar189 = vmulpd_avx512vl(auVar60,auVar45);
      auVar68._8_8_ = local_1e20._888_8_;
      auVar68._0_8_ = local_1e20._880_8_;
      auVar213._0_8_ = auVar187._0_8_ + auVar189._0_8_;
      auVar213._8_8_ = auVar187._8_8_ + auVar189._8_8_;
      auVar187 = vmulpd_avx512vl(auVar83,auVar68);
      auVar25._8_8_ = local_1e20._72_8_;
      auVar25._0_8_ = local_1e20._64_8_;
      auVar187 = vaddpd_avx512vl(auVar213,auVar187);
      auVar189 = vmulpd_avx512vl(auVar61,auVar46);
      auVar48._8_8_ = local_1e20._504_8_;
      auVar48._0_8_ = local_1e20._496_8_;
      auVar214._0_8_ = (double)uVar121 * (double)local_1e20._32_8_ + auVar189._0_8_;
      auVar214._8_8_ = (double)uVar122 * (double)local_1e20._40_8_ + auVar189._8_8_;
      auVar224._0_8_ = (double)uVar175 * (double)local_1e20._896_8_;
      auVar224._8_8_ = (double)uVar176 * (double)local_1e20._904_8_;
      auVar189 = vaddpd_avx512vl(auVar214,auVar224);
      auVar190 = vmulpd_avx512vl(auVar62,auVar47);
      auVar26._8_8_ = local_1e20._88_8_;
      auVar26._0_8_ = local_1e20._80_8_;
      auVar69._8_8_ = local_1e20._920_8_;
      auVar69._0_8_ = local_1e20._912_8_;
      auVar191 = vmulpd_avx512vl(auVar85,auVar69);
      auVar235._0_8_ = (double)uVar123 * (double)local_1e20._48_8_ + auVar190._0_8_ + auVar191._0_8_
      ;
      auVar235._8_8_ = (double)uVar124 * (double)local_1e20._56_8_ + auVar190._8_8_ + auVar191._8_8_
      ;
      auVar190 = vmulpd_avx512vl(auVar48,auVar63);
      auVar191 = vmulpd_avx512vl(auVar98,auVar25);
      auVar193 = vmulpd_avx512vl(auVar86,auVar70);
      auVar71._8_8_ = local_1e20._952_8_;
      auVar71._0_8_ = local_1e20._944_8_;
      auVar219._0_8_ = auVar191._0_8_ + auVar190._0_8_ + auVar193._0_8_;
      auVar219._8_8_ = auVar191._8_8_ + auVar190._8_8_ + auVar193._8_8_;
      auVar190 = vmulpd_avx512vl(auVar26,auVar41);
      auVar191 = vmulpd_avx512vl(auVar64,auVar49);
      auVar27._8_8_ = local_1e20._104_8_;
      auVar27._0_8_ = local_1e20._96_8_;
      auVar193 = vmulpd_avx512vl(auVar71,auVar87);
      auVar237._0_8_ = auVar190._0_8_ + auVar191._0_8_ + auVar193._0_8_;
      auVar237._8_8_ = auVar190._8_8_ + auVar191._8_8_ + auVar193._8_8_;
      auVar190 = vmulpd_avx512vl(auVar27,auVar42);
      auVar244._0_8_ =
           auVar190._0_8_ + (double)uVar147 * (double)local_1e20._528_8_ +
           (double)uVar177 * (double)local_1e20._960_8_;
      auVar244._8_8_ =
           auVar190._8_8_ + (double)uVar148 * (double)local_1e20._536_8_ +
           (double)uVar178 * (double)local_1e20._968_8_;
      auVar28._8_8_ = local_1e20._120_8_;
      auVar28._0_8_ = local_1e20._112_8_;
      auVar190 = vmulpd_avx512vl(auVar43,auVar28);
      auVar191 = vmulpd_avx512vl(auVar89,auVar72);
      auVar246._0_8_ =
           auVar190._0_8_ + (double)local_1e20._544_8_ * (double)uVar149 + auVar191._0_8_;
      auVar246._8_8_ =
           auVar190._8_8_ + (double)local_1e20._552_8_ * (double)uVar150 + auVar191._8_8_;
      auVar29._8_8_ = local_1e20._136_8_;
      auVar29._0_8_ = local_1e20._128_8_;
      auVar50._8_8_ = local_1e20._568_8_;
      auVar50._0_8_ = local_1e20._560_8_;
      auVar190 = vmulpd_avx512vl(auVar50,auVar67);
      auVar191 = vmulpd_avx512vl(auVar44,auVar29);
      auVar190 = vaddpd_avx512vl(auVar191,auVar190);
      auVar73._8_8_ = local_1e20._1000_8_;
      auVar73._0_8_ = local_1e20._992_8_;
      auVar191 = vmulpd_avx512vl(auVar73,auVar90);
      auVar190 = vaddpd_avx512vl(auVar190,auVar191);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                     m_storage.m_data.array[0];
      auVar191 = vmovddup_avx512vl(auVar3);
      auVar17._8_8_ = dStack_2248;
      auVar17._0_8_ = local_2250;
      auVar193 = vmulpd_avx512vl(auVar191,auVar17);
      auVar188 = vaddpd_avx512vl(auVar188,auVar193);
      auVar19._8_8_ = local_2240[1];
      auVar19._0_8_ = local_2240[0];
      auVar193 = vmulpd_avx512vl(auVar191,auVar19);
      auVar187 = vaddpd_avx512vl(auVar187,auVar193);
      auVar21._8_8_ = local_2240[3];
      auVar21._0_8_ = local_2240[2];
      auVar193 = vmulpd_avx512vl(auVar191,auVar21);
      auVar189 = vaddpd_avx512vl(auVar189,auVar193);
      auVar23._8_8_ = dStack_2218;
      auVar23._0_8_ = local_2220;
      auVar193 = vmulpd_avx512vl(auVar191,auVar23);
      auVar193 = vaddpd_avx512vl(auVar235,auVar193);
      auVar197 = vmulpd_avx512vl(auVar191,local_2210);
      auVar197 = vaddpd_avx512vl(auVar219,auVar197);
      auVar200 = vmulpd_avx512vl(auVar191,local_2200);
      auVar200 = vaddpd_avx512vl(auVar237,auVar200);
      auVar192 = vmulpd_avx512vl(auVar191,local_21f0);
      auVar192 = vaddpd_avx512vl(auVar244,auVar192);
      auVar195 = vmulpd_avx512vl(auVar191,local_21e0);
      auVar195 = vaddpd_avx512vl(auVar246,auVar195);
      auVar191 = vmulpd_avx512vl(auVar191,local_21d0);
      auVar190 = vaddpd_avx512vl(auVar190,auVar191);
      local_12d0 = vmulpd_avx512vl(auVar188,*(undefined1 (*) [16])(pdVar182 + uVar179 * 0x12));
      local_12c0 = vmulpd_avx512vl(auVar187,*(undefined1 (*) [16])(pdVar182 + uVar179 * 0x12 + 2));
      local_12b0 = vmulpd_avx512vl(auVar189,*(undefined1 (*) [16])(pdVar182 + uVar179 * 0x12 + 4));
      dStack_1298 = auVar193._8_8_ * (pdVar182 + uVar179 * 0x12 + 6)[1];
      local_12a0 = auVar193._0_8_ * pdVar182[uVar179 * 0x12 + 6];
      dStack_1288 = auVar197._8_8_ * (pdVar182 + uVar179 * 0x12 + 8)[1];
      local_1290 = auVar197._0_8_ * pdVar182[uVar179 * 0x12 + 8];
      dStack_1278 = auVar200._8_8_ * (pdVar182 + uVar179 * 0x12 + 10)[1];
      local_1280 = auVar200._0_8_ * pdVar182[uVar179 * 0x12 + 10];
      dStack_1268 = auVar192._8_8_ * (pdVar182 + uVar179 * 0x12 + 0xc)[1];
      local_1270 = auVar192._0_8_ * pdVar182[uVar179 * 0x12 + 0xc];
      dStack_1258 = auVar195._8_8_ * (pdVar182 + uVar179 * 0x12 + 0xe)[1];
      local_1260 = auVar195._0_8_ * pdVar182[uVar179 * 0x12 + 0xe];
      local_1250 = vmulpd_avx512vl(auVar190,*(undefined1 (*) [16])(pdVar182 + uVar179 * 0x12 + 0x10)
                                  );
      uVar184 = 0xfffffffffffffffe;
      local_1f90 = auVar24;
      do {
        dVar183 = *(double *)(local_1e20 + uVar184 * 8 + 0xa8);
        dVar4 = *(double *)(local_1e20 + uVar184 * 8 + 600);
        dVar5 = *(double *)(local_1e20 + uVar184 * 8 + 0x18);
        dVar6 = *(double *)(local_1e20 + uVar184 * 8 + 0x1c8);
        dVar7 = *(double *)(local_18a0 + uVar184 * 8 + -0x58);
        dVar8 = local_1750[uVar184 + 1];
        dVar9 = local_1870[uVar184 + 1];
        dVar10 = *(double *)(local_18a0 + uVar184 * 8 + -0x178);
        dVar11 = local_15a0[uVar184 + 1];
        dVar12 = local_16c0[uVar184 + 1];
        dVar13 = *(double *)(local_18a0 + uVar184 * 8 + -0x208);
        dVar14 = local_1510[uVar184 + 1];
        local_2240[uVar184] =
             *(double *)(local_18a0 + uVar184 * 8 + -0x180) * local_15a0[uVar184] +
             *(double *)(local_1e20 + uVar184 * 8 + 0x250) * local_1750[uVar184] +
             *(double *)(local_1e20 + uVar184 * 8 + 0xa0) *
             *(double *)(local_18a0 + uVar184 * 8 + -0x60) +
             *(double *)(local_1e20 + uVar184 * 8 + 0x10) * local_1870[uVar184] +
             *(double *)(local_1e20 + uVar184 * 8 + 0x1c0) * local_16c0[uVar184] +
             *(double *)(local_18a0 + uVar184 * 8 + -0x210) * local_1510[uVar184];
        local_2240[uVar184 + 1] =
             dVar10 * dVar11 + dVar4 * dVar8 + dVar183 * dVar7 + dVar5 * dVar9 + dVar6 * dVar12 +
             dVar13 * dVar14;
        uVar184 = uVar184 + 2;
      } while (uVar184 < 0x10);
      auVar96._8_8_ = uVar146;
      auVar96._0_8_ = uVar145;
      auVar187 = vmulpd_avx512vl(auVar48,auVar96);
      auVar188 = vmulpd_avx512vl(auVar49,auVar56);
      auVar189 = vmulpd_avx512vl(auVar25,auVar32);
      auVar95._8_8_ = uVar116;
      auVar95._0_8_ = uVar115;
      auVar190 = vmulpd_avx512vl(auVar26,auVar95);
      auVar94._8_8_ = uVar174;
      auVar94._0_8_ = uVar173;
      auVar191 = vmulpd_avx512vl(auVar71,auVar94);
      auVar97._8_8_ = uVar118;
      auVar97._0_8_ = uVar117;
      auVar193 = vmulpd_avx512vl(auVar27,auVar97);
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = this->m_Alpha;
      local_1360 = (double)uVar101 * (double)uVar107 + (double)uVar125 * (double)uVar137 +
                   local_1fa0 * (double)uVar163 +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * local_2250;
      dStack_1358 = (double)uVar102 * (double)uVar108 + (double)uVar126 * (double)uVar138 +
                    dStack_1f98 * (double)uVar164 +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * dStack_2248;
      local_1350[0] =
           (double)local_1f90._0_8_ * (double)uVar109 + (double)uVar127 * (double)uVar139 +
           (double)uVar151 * (double)uVar165 +
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2240[0];
      local_1350[1] =
           (double)local_1f90._8_8_ * (double)uVar110 + (double)uVar128 * (double)uVar140 +
           (double)uVar152 * (double)uVar166 +
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2240[1];
      local_1350[2] =
           (double)uVar153 * (double)uVar167 +
           (double)uVar129 * (double)uVar141 + (double)local_1f80._0_8_ * (double)uVar111 +
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2240[2];
      local_1350[3] =
           (double)uVar154 * (double)uVar168 +
           (double)uVar130 * (double)uVar142 + (double)local_1f80._8_8_ * (double)uVar112 +
           local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data
           .array[0] * local_2240[3];
      local_1330 = (double)uVar103 * (double)uVar113 + (double)uVar131 * (double)uVar143 +
                   (double)uVar155 * (double)uVar169 +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * local_2220;
      dStack_1328 = (double)uVar104 * (double)uVar114 + (double)uVar132 * (double)uVar144 +
                    (double)uVar156 * (double)uVar170 +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * dStack_2218;
      local_1320 = auVar189._0_8_ + auVar187._0_8_ + (double)uVar157 * (double)uVar171 +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_2210._0_8_;
      dStack_1318 = auVar189._8_8_ + auVar187._8_8_ + (double)uVar158 * (double)uVar172 +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_2210._8_8_;
      local_1310 = auVar190._0_8_ + auVar188._0_8_ + auVar191._0_8_ +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_2200._0_8_;
      dStack_1308 = auVar190._8_8_ + auVar188._8_8_ + auVar191._8_8_ +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_2200._8_8_;
      local_1300 = auVar193._0_8_ + (double)local_1e20._528_8_ * (double)local_1e20._672_8_ +
                   (double)local_1e20._960_8_ * (double)local_1e20._1104_8_ +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_21f0._0_8_;
      dStack_12f8 = auVar193._8_8_ + (double)local_1e20._536_8_ * (double)local_1e20._680_8_ +
                    (double)local_1e20._968_8_ * (double)local_1e20._1112_8_ +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21f0._8_8_;
      local_12f0 = (double)local_1e20._112_8_ * (double)local_1e20._256_8_ +
                   (double)uVar133 * (double)local_1e20._688_8_ +
                   (double)uVar159 * (double)local_1e20._1120_8_ +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_21e0._0_8_;
      dStack_12e8 = (double)local_1e20._120_8_ * (double)local_1e20._264_8_ +
                    (double)uVar134 * (double)local_1e20._696_8_ +
                    (double)uVar160 * (double)local_1e20._1128_8_ +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21e0._8_8_;
      local_12e0 = (double)uVar105 * (double)local_1e20._272_8_ +
                   (double)uVar135 * (double)local_1e20._704_8_ +
                   (double)uVar161 * (double)local_1e20._1136_8_ +
                   local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                   m_storage.m_data.array[0] * (double)local_21d0._0_8_;
      dStack_12d8 = (double)uVar106 * (double)local_1e20._280_8_ +
                    (double)uVar136 * (double)local_1e20._712_8_ +
                    (double)uVar162 * (double)local_1e20._1144_8_ +
                    local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.
                    m_storage.m_data.array[0] * (double)local_21d0._8_8_;
      if (((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows < lVar1) ||
         ((this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols < 1)) goto LAB_00745bcf;
      pdVar182 = (this->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
      local_1360 = local_1360 * pdVar182[uVar179 * 0x12];
      dStack_1358 = dStack_1358 * (pdVar182 + uVar179 * 0x12)[1];
      local_1350[0] = local_1350[0] * pdVar182[uVar179 * 0x12 + 2];
      local_1350[1] = local_1350[1] * (pdVar182 + uVar179 * 0x12 + 2)[1];
      local_1350[2] = local_1350[2] * pdVar182[uVar179 * 0x12 + 4];
      local_1350[3] = local_1350[3] * (pdVar182 + uVar179 * 0x12 + 4)[1];
      local_1330 = local_1330 * pdVar182[uVar179 * 0x12 + 6];
      dStack_1328 = dStack_1328 * (pdVar182 + uVar179 * 0x12 + 6)[1];
      local_1320 = local_1320 * pdVar182[uVar179 * 0x12 + 8];
      dStack_1318 = dStack_1318 * (pdVar182 + uVar179 * 0x12 + 8)[1];
      local_1310 = local_1310 * pdVar182[uVar179 * 0x12 + 10];
      dStack_1308 = dStack_1308 * (pdVar182 + uVar179 * 0x12 + 10)[1];
      local_1300 = local_1300 * pdVar182[uVar179 * 0x12 + 0xc];
      dStack_12f8 = dStack_12f8 * (pdVar182 + uVar179 * 0x12 + 0xc)[1];
      local_12f0 = local_12f0 * pdVar182[uVar179 * 0x12 + 0xe];
      dStack_12e8 = dStack_12e8 * (pdVar182 + uVar179 * 0x12 + 0xe)[1];
      local_12e0 = local_12e0 * pdVar182[uVar179 * 0x12 + 0x10];
      dStack_12d8 = dStack_12d8 * (pdVar182 + uVar179 * 0x12 + 0x10)[1];
      pLVar186 = (this->m_layers).
                 super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      lVar1 = (long)pLVar186[uVar179].m_material.
                    super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      this_00 = (ChElementShellANCF_3833 *)
                pLVar186[uVar179].m_material.
                super___shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      if (this_00 == (ChElementShellANCF_3833 *)0x0) {
        this_00 = (ChElementShellANCF_3833 *)local_f40;
        memcpy(this_00,(void *)(lVar1 + 0x20),0x120);
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pCVar99 = (ChKblockGeneric *)
                    ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
          *(int *)&(pCVar99->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar99->super_ChKblock)._vptr_ChKblock + 1;
          UNLOCK();
        }
        else {
          pCVar99 = (ChKblockGeneric *)
                    ((long)&(this_00->super_ChElementShell).super_ChElementGeneric + 8);
          *(int *)&(pCVar99->super_ChKblock)._vptr_ChKblock =
               *(int *)&(pCVar99->super_ChKblock)._vptr_ChKblock + 1;
        }
        memcpy(local_f40,(void *)(lVar1 + 0x20),0x120);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00);
        pLVar186 = (local_1fb0->m_layers).
                   super__Vector_base<chrono::fea::ChElementShellANCF_3833::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3833::Layer>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      }
      RotateReorderStiffnessMatrix
                (this_00,(ChMatrixNM<double,_6,_6> *)local_f40,pLVar186[uVar179].m_theta);
      uVar124 = local_f40._40_8_;
      uVar123 = local_f40._32_8_;
      uVar122 = local_f40._24_8_;
      uVar121 = local_f40._16_8_;
      uVar120 = local_f40._8_8_;
      uVar119 = local_f40._0_8_;
      pMVar185 = local_1f60;
      this = local_1fb0;
      pdStack_21a8 = &local_1120;
      local_2258 = local_11b0;
      local_21b8 = &local_1240;
      uVar179 = 0xfffffffffffffffe;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = (double)local_f40._0_8_;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[1] = (double)&local_1090;
      local_1eb0 = (_func_int **)local_f40._8_8_;
      do {
        dVar183 = local_1080[uVar179 + 1];
        dVar4 = local_1110[uVar179 + 1];
        dVar5 = *(double *)(local_11a0 + uVar179 * 8 + 8);
        dVar6 = local_1230[uVar179 + 1];
        dVar7 = *(double *)(local_12c0 + uVar179 * 8 + 8);
        dVar8 = local_1350[uVar179 + 1];
        local_13e0[uVar179] =
             (double)uVar124 * local_1350[uVar179] +
             (double)uVar123 * *(double *)(local_12c0 + uVar179 * 8) +
             (double)uVar122 * local_1230[uVar179] +
             (double)uVar121 * *(double *)(local_11a0 + uVar179 * 8) +
             (double)uVar119 * local_1080[uVar179] + (double)uVar120 * local_1110[uVar179];
        local_13e0[uVar179 + 1] =
             (double)uVar124 * dVar8 +
             (double)uVar123 * dVar7 +
             (double)uVar122 * dVar6 +
             (double)uVar121 * dVar5 + (double)uVar119 * dVar183 + (double)uVar120 * dVar4;
        uVar106 = local_f40._88_8_;
        uVar105 = local_f40._80_8_;
        uVar104 = local_f40._72_8_;
        uVar103 = local_f40._64_8_;
        uVar102 = local_f40._56_8_;
        uVar101 = local_f40._48_8_;
        uVar179 = uVar179 + 2;
      } while (uVar179 < 0x10);
      uVar179 = 0xfffffffffffffffe;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = (double)local_f40._48_8_;
      local_1f40 = (pointer)local_f40._56_8_;
      pdStack_1ea8 = pdStack_21a8;
      do {
        dVar183 = local_1080[uVar179 + 1];
        dVar4 = local_1110[uVar179 + 1];
        dVar5 = *(double *)(local_11a0 + uVar179 * 8 + 8);
        dVar6 = local_1230[uVar179 + 1];
        dVar7 = *(double *)(local_12c0 + uVar179 * 8 + 8);
        dVar8 = local_1350[uVar179 + 1];
        local_1ea0[uVar179] =
             (double)uVar106 * local_1350[uVar179] +
             (double)uVar105 * *(double *)(local_12c0 + uVar179 * 8) +
             (double)uVar104 * local_1230[uVar179] +
             (double)uVar103 * *(double *)(local_11a0 + uVar179 * 8) +
             (double)uVar101 * local_1080[uVar179] + (double)uVar102 * local_1110[uVar179];
        local_1ea0[uVar179 + 1] =
             (double)uVar106 * dVar8 +
             (double)uVar105 * dVar7 +
             (double)uVar104 * dVar6 +
             (double)uVar103 * dVar5 + (double)uVar101 * dVar183 + (double)uVar102 * dVar4;
        uVar179 = uVar179 + 2;
      } while (uVar179 < 0x10);
      uVar179 = 0xfffffffffffffffe;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = (double)local_ee0;
      local_2090 = local_ed8;
      pdStack_1f38 = pdStack_21a8;
      do {
        dVar183 = local_1080[uVar179 + 1];
        dVar4 = local_1110[uVar179 + 1];
        dVar5 = *(double *)(local_11a0 + uVar179 * 8 + 8);
        dVar6 = local_1230[uVar179 + 1];
        dVar7 = *(double *)(local_12c0 + uVar179 * 8 + 8);
        dVar8 = local_1350[uVar179 + 1];
        local_1f30[uVar179] =
             (double)local_eb8 * local_1350[uVar179] +
             (double)local_ec0 * *(double *)(local_12c0 + uVar179 * 8) +
             (double)local_ec8 * local_1230[uVar179] +
             (double)local_ed0 * *(double *)(local_11a0 + uVar179 * 8) +
             (double)local_ee0 * local_1080[uVar179] + (double)local_ed8 * local_1110[uVar179];
        local_1f30[uVar179 + 1] =
             (double)local_eb8 * dVar8 +
             (double)local_ec0 * dVar7 +
             (double)local_ec8 * dVar6 +
             (double)local_ed0 * dVar5 + (double)local_ee0 * dVar183 + (double)local_ed8 * dVar4;
        uVar179 = uVar179 + 2;
      } while (uVar179 < 0x10);
      uVar179 = 0xfffffffffffffffe;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = (double)local_eb0;
      local_2120 = local_ea8;
      pdStack_2088 = pdStack_21a8;
      do {
        dVar183 = local_1080[uVar179 + 1];
        dVar4 = local_1110[uVar179 + 1];
        dVar5 = *(double *)(local_11a0 + uVar179 * 8 + 8);
        dVar6 = local_1230[uVar179 + 1];
        dVar7 = *(double *)(local_12c0 + uVar179 * 8 + 8);
        dVar8 = local_1350[uVar179 + 1];
        local_2080[uVar179] =
             local_e88 * local_1350[uVar179] +
             local_e90 * *(double *)(local_12c0 + uVar179 * 8) +
             local_e98 * local_1230[uVar179] +
             (double)local_ea0 * *(double *)(local_11a0 + uVar179 * 8) +
             (double)local_eb0 * local_1080[uVar179] + (double)local_ea8 * local_1110[uVar179];
        local_2080[uVar179 + 1] =
             local_e88 * dVar8 +
             local_e90 * dVar7 +
             local_e98 * dVar6 +
             (double)local_ea0 * dVar5 + (double)local_eb0 * dVar183 + (double)local_ea8 * dVar4;
        uVar179 = uVar179 + 2;
      } while (uVar179 < 0x10);
      uVar179 = 0xfffffffffffffffe;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = local_e80;
      local_21b0 = local_e78;
      pdStack_2118 = pdStack_21a8;
      do {
        dVar183 = local_1080[uVar179 + 1];
        dVar4 = local_1110[uVar179 + 1];
        dVar5 = *(double *)(local_11a0 + uVar179 * 8 + 8);
        dVar6 = local_1230[uVar179 + 1];
        dVar7 = *(double *)(local_12c0 + uVar179 * 8 + 8);
        dVar8 = local_1350[uVar179 + 1];
        local_2110[uVar179] =
             local_e58 * local_1350[uVar179] +
             local_e60 * *(double *)(local_12c0 + uVar179 * 8) +
             local_e68 * local_1230[uVar179] +
             local_e70 * *(double *)(local_11a0 + uVar179 * 8) +
             local_e80 * local_1080[uVar179] + local_e78 * local_1110[uVar179];
        local_2110[uVar179 + 1] =
             local_e58 * dVar8 +
             local_e60 * dVar7 +
             local_e68 * dVar6 + local_e70 * dVar5 + local_e80 * dVar183 + local_e78 * dVar4;
        uVar179 = uVar179 + 2;
      } while (uVar179 < 0x10);
      uVar179 = 0xfffffffffffffffe;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = local_e50;
      local_2000._0_8_ = local_e48;
      local_2260 = local_e40;
      local_21c0 = local_e38;
      local_1fc0 = local_e30;
      local_f50 = local_e28;
      local_f48 = &local_1360;
      local_2000._8_8_ = pdStack_21a8;
      local_1fb8 = local_12d0;
      do {
        dVar183 = local_1080[uVar179 + 1];
        dVar4 = local_1110[uVar179 + 1];
        dVar5 = *(double *)(local_11a0 + uVar179 * 8 + 8);
        dVar6 = local_1230[uVar179 + 1];
        dVar7 = *(double *)(local_12c0 + uVar179 * 8 + 8);
        dVar8 = local_1350[uVar179 + 1];
        local_21a0[uVar179] =
             local_e28 * local_1350[uVar179] +
             local_e30 * *(double *)(local_12c0 + uVar179 * 8) +
             local_e38 * local_1230[uVar179] +
             local_e40 * *(double *)(local_11a0 + uVar179 * 8) +
             local_e50 * local_1080[uVar179] + (double)local_e48 * local_1110[uVar179];
        local_21a0[uVar179 + 1] =
             local_e28 * dVar8 +
             local_e30 * dVar7 +
             local_e38 * dVar6 + local_e40 * dVar5 + local_e50 * dVar183 + (double)local_e48 * dVar4
        ;
        uVar179 = uVar179 + 2;
      } while (uVar179 < 0x10);
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0] = (double)local_1e20._0_8_ * local_13f0 + (double)local_1e20._144_8_ * local_21b0 +
                 (double)local_1e20._288_8_ * (double)local_2120;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[1] = (double)local_1e20._8_8_ * dStack_13e8 +
                 (double)local_1e20._152_8_ * (double)pdStack_21a8 +
                 (double)local_1e20._296_8_ * (double)pdStack_2118;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[2] = (double)local_1e20._16_8_ * local_13e0[0] +
                 (double)local_1e20._160_8_ * local_21a0[0] +
                 (double)local_1e20._304_8_ * local_2110[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[3] = (double)local_1e20._24_8_ * local_13e0[1] +
                 (double)local_1e20._168_8_ * local_21a0[1] +
                 (double)local_1e20._312_8_ * local_2110[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[4] = (double)local_1e20._32_8_ * local_13e0[2] +
                 (double)local_1e20._176_8_ * local_21a0[2] +
                 (double)local_1e20._320_8_ * local_2110[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[5] = (double)local_1e20._40_8_ * local_13e0[3] +
                 (double)local_1e20._184_8_ * local_21a0[3] +
                 (double)local_1e20._328_8_ * local_2110[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[6] = (double)local_1e20._48_8_ * local_13c0 + (double)local_1e20._192_8_ * local_2180 +
                 (double)local_1e20._336_8_ * local_20f0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[7] = (double)local_1e20._56_8_ * dStack_13b8 + (double)local_1e20._200_8_ * dStack_2178
                 + (double)local_1e20._344_8_ * dStack_20e8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[8] = (double)local_1e20._64_8_ * local_13b0 + (double)local_1e20._208_8_ * local_2170 +
                 (double)local_1e20._352_8_ * local_20e0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[9] = (double)local_1e20._72_8_ * dStack_13a8 + (double)local_1e20._216_8_ * dStack_2168
                 + (double)local_1e20._360_8_ * dStack_20d8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[10] = (double)local_1e20._80_8_ * local_13a0 + (double)local_1e20._224_8_ * local_2160 +
                  (double)local_1e20._368_8_ * local_20d0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xb] = (double)local_1e20._88_8_ * dStack_1398 +
                   (double)local_1e20._232_8_ * dStack_2158 +
                   (double)local_1e20._376_8_ * dStack_20c8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xc] = (double)local_1e20._96_8_ * local_1390 + (double)local_1e20._240_8_ * local_2150
                   + (double)local_1e20._384_8_ * local_20c0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xd] = (double)local_1e20._104_8_ * dStack_1388 +
                   (double)local_1e20._248_8_ * dStack_2148 +
                   (double)local_1e20._392_8_ * dStack_20b8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xe] = (double)local_1e20._112_8_ * local_1380 + (double)local_1e20._256_8_ * local_2140
                   + (double)local_1e20._400_8_ * local_20b0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xf] = (double)local_1e20._120_8_ * dStack_1378 +
                   (double)local_1e20._264_8_ * dStack_2138 +
                   (double)local_1e20._408_8_ * dStack_20a8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x10] = (double)local_1e20._128_8_ * local_1370 +
                    (double)local_1e20._272_8_ * local_2130 +
                    (double)local_1e20._416_8_ * local_20a0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x11] = (double)local_1e20._136_8_ * dStack_1368 +
                    (double)local_1e20._280_8_ * dStack_2128 +
                    (double)local_1e20._424_8_ * dStack_2098;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x36] = (double)local_1e20._432_8_ * local_13f0 +
                    (double)local_1e20._576_8_ * local_21b0 +
                    (double)local_1e20._720_8_ * (double)local_2120;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x37] = (double)local_1e20._440_8_ * dStack_13e8 +
                    (double)local_1e20._584_8_ * (double)pdStack_21a8 +
                    (double)local_1e20._728_8_ * (double)pdStack_2118;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x38] = (double)local_1e20._448_8_ * local_13e0[0] +
                    (double)local_1e20._592_8_ * local_21a0[0] +
                    (double)local_1e20._736_8_ * local_2110[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x39] = (double)local_1e20._456_8_ * local_13e0[1] +
                    (double)local_1e20._600_8_ * local_21a0[1] +
                    (double)local_1e20._744_8_ * local_2110[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3a] = (double)local_1e20._464_8_ * local_13e0[2] +
                    (double)local_1e20._608_8_ * local_21a0[2] +
                    (double)local_1e20._752_8_ * local_2110[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3b] = (double)local_1e20._472_8_ * local_13e0[3] +
                    (double)local_1e20._616_8_ * local_21a0[3] +
                    (double)local_1e20._760_8_ * local_2110[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3c] = (double)local_1e20._480_8_ * local_13c0 +
                    (double)local_1e20._624_8_ * local_2180 +
                    (double)local_1e20._768_8_ * local_20f0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3d] = (double)local_1e20._488_8_ * dStack_13b8 +
                    (double)local_1e20._632_8_ * dStack_2178 +
                    (double)local_1e20._776_8_ * dStack_20e8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3e] = (double)local_1e20._496_8_ * local_13b0 +
                    (double)local_1e20._640_8_ * local_2170 +
                    (double)local_1e20._784_8_ * local_20e0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x3f] = (double)local_1e20._504_8_ * dStack_13a8 +
                    (double)local_1e20._648_8_ * dStack_2168 +
                    (double)local_1e20._792_8_ * dStack_20d8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x40] = (double)local_1e20._512_8_ * local_13a0 +
                    (double)local_1e20._656_8_ * local_2160 +
                    (double)local_1e20._800_8_ * local_20d0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x41] = (double)local_1e20._520_8_ * dStack_1398 +
                    (double)local_1e20._664_8_ * dStack_2158 +
                    (double)local_1e20._808_8_ * dStack_20c8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x42] = (double)local_1e20._528_8_ * local_1390 +
                    (double)local_1e20._672_8_ * local_2150 +
                    (double)local_1e20._816_8_ * local_20c0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x43] = (double)local_1e20._536_8_ * dStack_1388 +
                    (double)local_1e20._680_8_ * dStack_2148 +
                    (double)local_1e20._824_8_ * dStack_20b8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x44] = (double)local_1e20._544_8_ * local_1380 +
                    (double)local_1e20._688_8_ * local_2140 +
                    (double)local_1e20._832_8_ * local_20b0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x45] = (double)local_1e20._552_8_ * dStack_1378 +
                    (double)local_1e20._696_8_ * dStack_2138 +
                    (double)local_1e20._840_8_ * dStack_20a8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x46] = (double)local_1e20._560_8_ * local_1370 +
                    (double)local_1e20._704_8_ * local_2130 +
                    (double)local_1e20._848_8_ * local_20a0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x47] = (double)local_1e20._568_8_ * dStack_1368 +
                    (double)local_1e20._712_8_ * dStack_2128 +
                    (double)local_1e20._856_8_ * dStack_2098;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6c] = (double)local_1e20._864_8_ * local_13f0 +
                    (double)local_1e20._1008_8_ * local_21b0 +
                    (double)local_1e20._1152_8_ * (double)local_2120;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6d] = (double)local_1e20._872_8_ * dStack_13e8 +
                    (double)local_1e20._1016_8_ * (double)pdStack_21a8 +
                    (double)local_1e20._1160_8_ * (double)pdStack_2118;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6e] = (double)local_1e20._880_8_ * local_13e0[0] +
                    (double)local_1e20._1024_8_ * local_21a0[0] +
                    (double)local_1e20._1168_8_ * local_2110[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6f] = (double)local_1e20._888_8_ * local_13e0[1] +
                    (double)local_1e20._1032_8_ * local_21a0[1] +
                    (double)local_1e20._1176_8_ * local_2110[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x70] = (double)local_1e20._896_8_ * local_13e0[2] +
                    (double)local_1e20._1040_8_ * local_21a0[2] +
                    (double)local_1e20._1184_8_ * local_2110[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x71] = (double)local_1e20._904_8_ * local_13e0[3] +
                    (double)local_1e20._1048_8_ * local_21a0[3] +
                    (double)local_1e20._1192_8_ * local_2110[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x72] = (double)local_1e20._912_8_ * local_13c0 +
                    (double)local_1e20._1056_8_ * local_2180 +
                    (double)local_1e20._1200_8_ * local_20f0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x73] = (double)local_1e20._920_8_ * dStack_13b8 +
                    (double)local_1e20._1064_8_ * dStack_2178 +
                    (double)local_1e20._1208_8_ * dStack_20e8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x74] = (double)local_1e20._928_8_ * local_13b0 +
                    (double)local_1e20._1072_8_ * local_2170 +
                    (double)local_1e20._1216_8_ * local_20e0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x75] = (double)local_1e20._936_8_ * dStack_13a8 +
                    (double)local_1e20._1080_8_ * dStack_2168 +
                    (double)local_1e20._1224_8_ * dStack_20d8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x76] = (double)local_1e20._944_8_ * local_13a0 +
                    (double)local_1e20._1088_8_ * local_2160 +
                    (double)local_1e20._1232_8_ * local_20d0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x77] = (double)local_1e20._952_8_ * dStack_1398 +
                    (double)local_1e20._1096_8_ * dStack_2158 +
                    (double)local_1e20._1240_8_ * dStack_20c8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x78] = (double)local_1e20._960_8_ * local_1390 +
                    (double)local_1e20._1104_8_ * local_2150 +
                    (double)local_1e20._1248_8_ * local_20c0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x79] = (double)local_1e20._968_8_ * dStack_1388 +
                    (double)local_1e20._1112_8_ * dStack_2148 +
                    (double)local_1e20._1256_8_ * dStack_20b8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7a] = (double)local_1e20._976_8_ * local_1380 +
                    (double)local_1e20._1120_8_ * local_2140 +
                    (double)local_1e20._1264_8_ * local_20b0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7b] = (double)local_1e20._984_8_ * dStack_1378 +
                    (double)local_1e20._1128_8_ * dStack_2138 +
                    (double)local_1e20._1272_8_ * dStack_20a8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7c] = (double)local_1e20._992_8_ * local_1370 +
                    (double)local_1e20._1136_8_ * local_2130 +
                    (double)local_1e20._1280_8_ * local_20a0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7d] = (double)local_1e20._1000_8_ * dStack_1368 +
                    (double)local_1e20._1144_8_ * dStack_2128 +
                    (double)local_1e20._1288_8_ * dStack_2098;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x12] = (double)local_1e20._0_8_ * local_21b0 +
                    (double)local_1e20._144_8_ * (double)local_1eb0 +
                    (double)local_1e20._288_8_ * (double)local_2090;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x13] = (double)local_1e20._8_8_ * (double)pdStack_21a8 +
                    (double)local_1e20._152_8_ * (double)pdStack_1ea8 +
                    (double)local_1e20._296_8_ * (double)pdStack_2088;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x14] = (double)local_1e20._16_8_ * local_21a0[0] +
                    (double)local_1e20._160_8_ * local_1ea0[0] +
                    (double)local_1e20._304_8_ * local_2080[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x15] = (double)local_1e20._24_8_ * local_21a0[1] +
                    (double)local_1e20._168_8_ * local_1ea0[1] +
                    (double)local_1e20._312_8_ * local_2080[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x16] = (double)local_1e20._32_8_ * local_21a0[2] +
                    (double)local_1e20._176_8_ * local_1ea0[2] +
                    (double)local_1e20._320_8_ * local_2080[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x17] = (double)local_1e20._40_8_ * local_21a0[3] +
                    (double)local_1e20._184_8_ * local_1ea0[3] +
                    (double)local_1e20._328_8_ * local_2080[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x18] = (double)local_1e20._48_8_ * local_2180 + (double)local_1e20._192_8_ * local_1e80
                    + (double)local_1e20._336_8_ * local_2060;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x19] = (double)local_1e20._56_8_ * dStack_2178 +
                    (double)local_1e20._200_8_ * dStack_1e78 +
                    (double)local_1e20._344_8_ * dStack_2058;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1a] = (double)local_1e20._64_8_ * local_2170 + (double)local_1e20._208_8_ * local_1e70
                    + (double)local_1e20._352_8_ * local_2050;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1b] = (double)local_1e20._72_8_ * dStack_2168 +
                    (double)local_1e20._216_8_ * dStack_1e68 +
                    (double)local_1e20._360_8_ * dStack_2048;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1c] = (double)local_1e20._80_8_ * local_2160 + (double)local_1e20._224_8_ * local_1e60
                    + (double)local_1e20._368_8_ * local_2040;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1d] = (double)local_1e20._88_8_ * dStack_2158 +
                    (double)local_1e20._232_8_ * dStack_1e58 +
                    (double)local_1e20._376_8_ * dStack_2038;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1e] = (double)local_1e20._96_8_ * local_2150 + (double)local_1e20._240_8_ * local_1e50
                    + (double)local_1e20._384_8_ * local_2030;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x1f] = (double)local_1e20._104_8_ * dStack_2148 +
                    (double)local_1e20._248_8_ * dStack_1e48 +
                    (double)local_1e20._392_8_ * dStack_2028;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x20] = (double)local_1e20._112_8_ * local_2140 +
                    (double)local_1e20._256_8_ * local_1e40 +
                    (double)local_1e20._400_8_ * local_2020;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x21] = (double)local_1e20._120_8_ * dStack_2138 +
                    (double)local_1e20._264_8_ * dStack_1e38 +
                    (double)local_1e20._408_8_ * dStack_2018;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x22] = (double)local_1e20._128_8_ * local_2130 +
                    (double)local_1e20._272_8_ * local_1e30 +
                    (double)local_1e20._416_8_ * local_2010;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x23] = (double)local_1e20._136_8_ * dStack_2128 +
                    (double)local_1e20._280_8_ * dStack_1e28 +
                    (double)local_1e20._424_8_ * dStack_2008;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x48] = (double)local_1e20._432_8_ * local_21b0 +
                    (double)local_1e20._576_8_ * (double)local_1eb0 +
                    (double)local_1e20._720_8_ * (double)local_2090;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x49] = (double)local_1e20._440_8_ * (double)pdStack_21a8 +
                    (double)local_1e20._584_8_ * (double)pdStack_1ea8 +
                    (double)local_1e20._728_8_ * (double)pdStack_2088;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4a] = (double)local_1e20._448_8_ * local_21a0[0] +
                    (double)local_1e20._592_8_ * local_1ea0[0] +
                    (double)local_1e20._736_8_ * local_2080[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4b] = (double)local_1e20._456_8_ * local_21a0[1] +
                    (double)local_1e20._600_8_ * local_1ea0[1] +
                    (double)local_1e20._744_8_ * local_2080[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4c] = (double)local_1e20._464_8_ * local_21a0[2] +
                    (double)local_1e20._608_8_ * local_1ea0[2] +
                    (double)local_1e20._752_8_ * local_2080[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4d] = (double)local_1e20._472_8_ * local_21a0[3] +
                    (double)local_1e20._616_8_ * local_1ea0[3] +
                    (double)local_1e20._760_8_ * local_2080[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4e] = (double)local_1e20._480_8_ * local_2180 +
                    (double)local_1e20._624_8_ * local_1e80 +
                    (double)local_1e20._768_8_ * local_2060;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x4f] = (double)local_1e20._488_8_ * dStack_2178 +
                    (double)local_1e20._632_8_ * dStack_1e78 +
                    (double)local_1e20._776_8_ * dStack_2058;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x50] = (double)local_1e20._496_8_ * local_2170 +
                    (double)local_1e20._640_8_ * local_1e70 +
                    (double)local_1e20._784_8_ * local_2050;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x51] = (double)local_1e20._504_8_ * dStack_2168 +
                    (double)local_1e20._648_8_ * dStack_1e68 +
                    (double)local_1e20._792_8_ * dStack_2048;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x52] = (double)local_1e20._512_8_ * local_2160 +
                    (double)local_1e20._656_8_ * local_1e60 +
                    (double)local_1e20._800_8_ * local_2040;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x53] = (double)local_1e20._520_8_ * dStack_2158 +
                    (double)local_1e20._664_8_ * dStack_1e58 +
                    (double)local_1e20._808_8_ * dStack_2038;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x54] = (double)local_1e20._528_8_ * local_2150 +
                    (double)local_1e20._672_8_ * local_1e50 +
                    (double)local_1e20._816_8_ * local_2030;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x55] = (double)local_1e20._536_8_ * dStack_2148 +
                    (double)local_1e20._680_8_ * dStack_1e48 +
                    (double)local_1e20._824_8_ * dStack_2028;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x56] = (double)local_1e20._544_8_ * local_2140 +
                    (double)local_1e20._688_8_ * local_1e40 +
                    (double)local_1e20._832_8_ * local_2020;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x57] = (double)local_1e20._552_8_ * dStack_2138 +
                    (double)local_1e20._696_8_ * dStack_1e38 +
                    (double)local_1e20._840_8_ * dStack_2018;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x58] = (double)local_1e20._560_8_ * local_2130 +
                    (double)local_1e20._704_8_ * local_1e30 +
                    (double)local_1e20._848_8_ * local_2010;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x59] = (double)local_1e20._568_8_ * dStack_2128 +
                    (double)local_1e20._712_8_ * dStack_1e28 +
                    (double)local_1e20._856_8_ * dStack_2008;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7e] = (double)local_1e20._864_8_ * local_21b0 +
                    (double)local_1e20._1008_8_ * (double)local_1eb0 +
                    (double)local_1e20._1152_8_ * (double)local_2090;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x7f] = (double)local_1e20._872_8_ * (double)pdStack_21a8 +
                    (double)local_1e20._1016_8_ * (double)pdStack_1ea8 +
                    (double)local_1e20._1160_8_ * (double)pdStack_2088;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x80] = (double)local_1e20._880_8_ * local_21a0[0] +
                    (double)local_1e20._1024_8_ * local_1ea0[0] +
                    (double)local_1e20._1168_8_ * local_2080[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x81] = (double)local_1e20._888_8_ * local_21a0[1] +
                    (double)local_1e20._1032_8_ * local_1ea0[1] +
                    (double)local_1e20._1176_8_ * local_2080[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x82] = (double)local_1e20._896_8_ * local_21a0[2] +
                    (double)local_1e20._1040_8_ * local_1ea0[2] +
                    (double)local_1e20._1184_8_ * local_2080[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x83] = (double)local_1e20._904_8_ * local_21a0[3] +
                    (double)local_1e20._1048_8_ * local_1ea0[3] +
                    (double)local_1e20._1192_8_ * local_2080[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x84] = (double)local_1e20._912_8_ * local_2180 +
                    (double)local_1e20._1056_8_ * local_1e80 +
                    (double)local_1e20._1200_8_ * local_2060;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x85] = (double)local_1e20._920_8_ * dStack_2178 +
                    (double)local_1e20._1064_8_ * dStack_1e78 +
                    (double)local_1e20._1208_8_ * dStack_2058;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x86] = (double)local_1e20._928_8_ * local_2170 +
                    (double)local_1e20._1072_8_ * local_1e70 +
                    (double)local_1e20._1216_8_ * local_2050;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x87] = (double)local_1e20._936_8_ * dStack_2168 +
                    (double)local_1e20._1080_8_ * dStack_1e68 +
                    (double)local_1e20._1224_8_ * dStack_2048;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x88] = (double)local_1e20._944_8_ * local_2160 +
                    (double)local_1e20._1088_8_ * local_1e60 +
                    (double)local_1e20._1232_8_ * local_2040;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x89] = (double)local_1e20._952_8_ * dStack_2158 +
                    (double)local_1e20._1096_8_ * dStack_1e58 +
                    (double)local_1e20._1240_8_ * dStack_2038;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8a] = (double)local_1e20._960_8_ * local_2150 +
                    (double)local_1e20._1104_8_ * local_1e50 +
                    (double)local_1e20._1248_8_ * local_2030;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8b] = (double)local_1e20._968_8_ * dStack_2148 +
                    (double)local_1e20._1112_8_ * dStack_1e48 +
                    (double)local_1e20._1256_8_ * dStack_2028;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8c] = (double)local_1e20._976_8_ * local_2140 +
                    (double)local_1e20._1120_8_ * local_1e40 +
                    (double)local_1e20._1264_8_ * local_2020;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8d] = (double)local_1e20._984_8_ * dStack_2138 +
                    (double)local_1e20._1128_8_ * dStack_1e38 +
                    (double)local_1e20._1272_8_ * dStack_2018;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8e] = (double)local_1e20._992_8_ * local_2130 +
                    (double)local_1e20._1136_8_ * local_1e30 +
                    (double)local_1e20._1280_8_ * local_2010;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x8f] = (double)local_1e20._1000_8_ * dStack_2128 +
                    (double)local_1e20._1144_8_ * dStack_1e28 +
                    (double)local_1e20._1288_8_ * dStack_2008;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x24] = (double)local_1e20._0_8_ * (double)local_2120 +
                    (double)local_1e20._144_8_ * (double)local_2090 +
                    (double)local_1e20._288_8_ * (double)local_1f40;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x25] = (double)local_1e20._8_8_ * (double)pdStack_2118 +
                    (double)local_1e20._152_8_ * (double)pdStack_2088 +
                    (double)local_1e20._296_8_ * (double)pdStack_1f38;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x26] = (double)local_1e20._16_8_ * local_2110[0] +
                    (double)local_1e20._160_8_ * local_2080[0] +
                    (double)local_1e20._304_8_ * local_1f30[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x27] = (double)local_1e20._24_8_ * local_2110[1] +
                    (double)local_1e20._168_8_ * local_2080[1] +
                    (double)local_1e20._312_8_ * local_1f30[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x28] = (double)local_1e20._32_8_ * local_2110[2] +
                    (double)local_1e20._176_8_ * local_2080[2] +
                    (double)local_1e20._320_8_ * local_1f30[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x29] = (double)local_1e20._40_8_ * local_2110[3] +
                    (double)local_1e20._184_8_ * local_2080[3] +
                    (double)local_1e20._328_8_ * local_1f30[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2a] = (double)local_1e20._48_8_ * local_20f0 + (double)local_1e20._192_8_ * local_2060
                    + (double)local_1e20._336_8_ * local_1f10;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2b] = (double)local_1e20._56_8_ * dStack_20e8 +
                    (double)local_1e20._200_8_ * dStack_2058 +
                    (double)local_1e20._344_8_ * dStack_1f08;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2c] = (double)local_1e20._64_8_ * local_20e0 + (double)local_1e20._208_8_ * local_2050
                    + (double)local_1e20._352_8_ * local_1f00;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2d] = (double)local_1e20._72_8_ * dStack_20d8 +
                    (double)local_1e20._216_8_ * dStack_2048 +
                    (double)local_1e20._360_8_ * dStack_1ef8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2e] = (double)local_1e20._80_8_ * local_20d0 + (double)local_1e20._224_8_ * local_2040
                    + (double)local_1e20._368_8_ * local_1ef0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x2f] = (double)local_1e20._88_8_ * dStack_20c8 +
                    (double)local_1e20._232_8_ * dStack_2038 +
                    (double)local_1e20._376_8_ * dStack_1ee8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x30] = (double)local_1e20._96_8_ * local_20c0 + (double)local_1e20._240_8_ * local_2030
                    + (double)local_1e20._384_8_ * local_1ee0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x31] = (double)local_1e20._104_8_ * dStack_20b8 +
                    (double)local_1e20._248_8_ * dStack_2028 +
                    (double)local_1e20._392_8_ * dStack_1ed8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x32] = (double)local_1e20._112_8_ * local_20b0 +
                    (double)local_1e20._256_8_ * local_2020 +
                    (double)local_1e20._400_8_ * local_1ed0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x33] = (double)local_1e20._120_8_ * dStack_20a8 +
                    (double)local_1e20._264_8_ * dStack_2018 +
                    (double)local_1e20._408_8_ * dStack_1ec8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x34] = (double)local_1e20._128_8_ * local_20a0 +
                    (double)local_1e20._272_8_ * local_2010 +
                    (double)local_1e20._416_8_ * local_1ec0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x35] = (double)local_1e20._136_8_ * dStack_2098 +
                    (double)local_1e20._280_8_ * dStack_2008 +
                    (double)local_1e20._424_8_ * dStack_1eb8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5a] = (double)local_1e20._432_8_ * (double)local_2120 +
                    (double)local_1e20._576_8_ * (double)local_2090 +
                    (double)local_1e20._720_8_ * (double)local_1f40;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5b] = (double)local_1e20._440_8_ * (double)pdStack_2118 +
                    (double)local_1e20._584_8_ * (double)pdStack_2088 +
                    (double)local_1e20._728_8_ * (double)pdStack_1f38;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5c] = (double)local_1e20._448_8_ * local_2110[0] +
                    (double)local_1e20._592_8_ * local_2080[0] +
                    (double)local_1e20._736_8_ * local_1f30[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5d] = (double)local_1e20._456_8_ * local_2110[1] +
                    (double)local_1e20._600_8_ * local_2080[1] +
                    (double)local_1e20._744_8_ * local_1f30[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5e] = (double)local_1e20._464_8_ * local_2110[2] +
                    (double)local_1e20._608_8_ * local_2080[2] +
                    (double)local_1e20._752_8_ * local_1f30[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x5f] = (double)local_1e20._472_8_ * local_2110[3] +
                    (double)local_1e20._616_8_ * local_2080[3] +
                    (double)local_1e20._760_8_ * local_1f30[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x60] = (double)local_1e20._480_8_ * local_20f0 +
                    (double)local_1e20._624_8_ * local_2060 +
                    (double)local_1e20._768_8_ * local_1f10;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x61] = (double)local_1e20._488_8_ * dStack_20e8 +
                    (double)local_1e20._632_8_ * dStack_2058 +
                    (double)local_1e20._776_8_ * dStack_1f08;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x62] = (double)local_1e20._496_8_ * local_20e0 +
                    (double)local_1e20._640_8_ * local_2050 +
                    (double)local_1e20._784_8_ * local_1f00;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[99] = (double)local_1e20._504_8_ * dStack_20d8 +
                  (double)local_1e20._648_8_ * dStack_2048 +
                  (double)local_1e20._792_8_ * dStack_1ef8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[100] = (double)local_1e20._512_8_ * local_20d0 + (double)local_1e20._656_8_ * local_2040
                   + (double)local_1e20._800_8_ * local_1ef0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x65] = (double)local_1e20._520_8_ * dStack_20c8 +
                    (double)local_1e20._664_8_ * dStack_2038 +
                    (double)local_1e20._808_8_ * dStack_1ee8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x66] = (double)local_1e20._528_8_ * local_20c0 +
                    (double)local_1e20._672_8_ * local_2030 +
                    (double)local_1e20._816_8_ * local_1ee0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x67] = (double)local_1e20._536_8_ * dStack_20b8 +
                    (double)local_1e20._680_8_ * dStack_2028 +
                    (double)local_1e20._824_8_ * dStack_1ed8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x68] = (double)local_1e20._544_8_ * local_20b0 +
                    (double)local_1e20._688_8_ * local_2020 +
                    (double)local_1e20._832_8_ * local_1ed0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x69] = (double)local_1e20._552_8_ * dStack_20a8 +
                    (double)local_1e20._696_8_ * dStack_2018 +
                    (double)local_1e20._840_8_ * dStack_1ec8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6a] = (double)local_1e20._560_8_ * local_20a0 +
                    (double)local_1e20._704_8_ * local_2010 +
                    (double)local_1e20._848_8_ * local_1ec0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x6b] = (double)local_1e20._568_8_ * dStack_2098 +
                    (double)local_1e20._712_8_ * dStack_2008 +
                    (double)local_1e20._856_8_ * dStack_1eb8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x90] = (double)local_1e20._864_8_ * (double)local_2120 +
                    (double)local_1e20._1008_8_ * (double)local_2090 +
                    (double)local_1e20._1152_8_ * (double)local_1f40;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x91] = (double)local_1e20._872_8_ * (double)pdStack_2118 +
                    (double)local_1e20._1016_8_ * (double)pdStack_2088 +
                    (double)local_1e20._1160_8_ * (double)pdStack_1f38;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x92] = (double)local_1e20._880_8_ * local_2110[0] +
                    (double)local_1e20._1024_8_ * local_2080[0] +
                    (double)local_1e20._1168_8_ * local_1f30[0];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x93] = (double)local_1e20._888_8_ * local_2110[1] +
                    (double)local_1e20._1032_8_ * local_2080[1] +
                    (double)local_1e20._1176_8_ * local_1f30[1];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x94] = (double)local_1e20._896_8_ * local_2110[2] +
                    (double)local_1e20._1040_8_ * local_2080[2] +
                    (double)local_1e20._1184_8_ * local_1f30[2];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x95] = (double)local_1e20._904_8_ * local_2110[3] +
                    (double)local_1e20._1048_8_ * local_2080[3] +
                    (double)local_1e20._1192_8_ * local_1f30[3];
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x96] = (double)local_1e20._912_8_ * local_20f0 +
                    (double)local_1e20._1056_8_ * local_2060 +
                    (double)local_1e20._1200_8_ * local_1f10;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x97] = (double)local_1e20._920_8_ * dStack_20e8 +
                    (double)local_1e20._1064_8_ * dStack_2058 +
                    (double)local_1e20._1208_8_ * dStack_1f08;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x98] = (double)local_1e20._928_8_ * local_20e0 +
                    (double)local_1e20._1072_8_ * local_2050 +
                    (double)local_1e20._1216_8_ * local_1f00;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x99] = (double)local_1e20._936_8_ * dStack_20d8 +
                    (double)local_1e20._1080_8_ * dStack_2048 +
                    (double)local_1e20._1224_8_ * dStack_1ef8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9a] = (double)local_1e20._944_8_ * local_20d0 +
                    (double)local_1e20._1088_8_ * local_2040 +
                    (double)local_1e20._1232_8_ * local_1ef0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9b] = (double)local_1e20._952_8_ * dStack_20c8 +
                    (double)local_1e20._1096_8_ * dStack_2038 +
                    (double)local_1e20._1240_8_ * dStack_1ee8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9c] = (double)local_1e20._960_8_ * local_20c0 +
                    (double)local_1e20._1104_8_ * local_2030 +
                    (double)local_1e20._1248_8_ * local_1ee0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9d] = (double)local_1e20._968_8_ * dStack_20b8 +
                    (double)local_1e20._1112_8_ * dStack_2028 +
                    (double)local_1e20._1256_8_ * dStack_1ed8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9e] = (double)local_1e20._976_8_ * local_20b0 +
                    (double)local_1e20._1120_8_ * local_2020 +
                    (double)local_1e20._1264_8_ * local_1ed0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0x9f] = (double)local_1e20._984_8_ * dStack_20a8 +
                    (double)local_1e20._1128_8_ * dStack_2018 +
                    (double)local_1e20._1272_8_ * dStack_1ec8;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xa0] = (double)local_1e20._992_8_ * local_20a0 +
                    (double)local_1e20._1136_8_ * local_2010 +
                    (double)local_1e20._1280_8_ * local_1ec0;
      local_c50.super_PlainObjectBase<Eigen::Matrix<double,_54,_3,_0,_54,_3>_>.m_storage.m_data.
      array[0xa1] = (double)local_1e20._1000_8_ * dStack_2098 +
                    (double)local_1e20._1144_8_ * dStack_2008 +
                    (double)local_1e20._1288_8_ * dStack_1eb8;
      if (((this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
           m_rows < 0x18) ||
         (lVar1 = (this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar1 < local_1f48)) goto LAB_00745be6;
      local_2000._0_8_ =
           local_1f58 +
           (long)(this->m_SD).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                 m_storage.m_data;
      local_1ff0 = pMVar185;
      local_1fe8.m_value = 0;
      local_1fe0.m_value = (long)local_1f50;
      local_1fd0 = &local_c50;
      local_2260 = 1.0;
      local_1fd8 = lVar1;
      Eigen::internal::
      generic_product_impl<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,24,54,false>,Eigen::Matrix<double,54,3,0,54,3>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,24,3,1,24,3>>
                (&local_740,
                 (Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_24,_54,_false> *)local_2000,
                 local_1fd0,&local_2260);
      uVar179 = local_1fa8 + 1;
    } while (uVar179 < (ulong)(long)this->m_numLayers);
  }
  pCVar100 = local_1f68;
  pdVar182 = (local_1f68->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
  if ((local_1f68->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      != 0x48) {
    if (pdVar182 != (double *)0x0) {
      free((void *)pdVar182[-1]);
    }
    pvVar180 = malloc(0x280);
    if (pvVar180 == (void *)0x0) {
      puVar181 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar181 = std::ostream::_M_insert<bool>;
      __cxa_throw(puVar181,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    *(void **)(((ulong)pvVar180 & 0xffffffffffffffc0) + 0x38) = pvVar180;
    pdVar182 = (double *)(((ulong)pvVar180 & 0xffffffffffffffc0) + 0x40);
    (pCVar100->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar182;
    (pCVar100->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
         0x48;
  }
  uVar179 = 0xfffffffffffffff8;
  do {
    dVar183 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar179 + 9];
    dVar4 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
            m_data.array[uVar179 + 10];
    dVar5 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
            m_data.array[uVar179 + 0xb];
    dVar6 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
            m_data.array[uVar179 + 0xc];
    dVar7 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
            m_data.array[uVar179 + 0xd];
    dVar8 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
            m_data.array[uVar179 + 0xe];
    dVar9 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
            m_data.array[uVar179 + 0xf];
    pdVar2 = pdVar182 + uVar179 + 8;
    *pdVar2 = local_740.super_PlainObjectBase<Eigen::Matrix<double,_24,_3,_1,_24,_3>_>.m_storage.
              m_data.array[uVar179 + 8];
    pdVar2[1] = dVar183;
    pdVar2[2] = dVar4;
    pdVar2[3] = dVar5;
    pdVar2[4] = dVar6;
    pdVar2[5] = dVar7;
    pdVar2[6] = dVar8;
    pdVar2[7] = dVar9;
    uVar179 = uVar179 + 8;
  } while (uVar179 < 0x40);
  return;
}

Assistant:

void ChElementShellANCF_3833::ComputeInternalForcesContIntDamping(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Continuous Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the generalized
    // internal force vector is integrated across the volume of the element every time this calculation is performed.
    // For a small number of layers this method can be more efficient than the "Pre-Integration" style calculation
    // method.  Note that the integrand for the generalize internal force vector for a straight and normalized element
    // is of order : 8 in xi, 8 in eta, and 8 in zeta. This requires GQ 5 points along the xi and eta directions and 5
    // points along zeta direction for "Full Integration". However, very similar results can be obtained with fewer GQ
    // point in each direction, resulting in significantly fewer calculations.  Based on testing, this could be as low
    // as 3x3x2

    MatrixNx6 ebar_ebardot;
    CalcCombinedCoordMatrix(ebar_ebardot);

    MatrixNx3 QiCompact;
    QiCompact.setZero();

    // Loop over all of the layers summing the contribution to the generalized internal force vector from each layer
    for (size_t kl = 0; kl < m_numLayers; kl++) {
        // =============================================================================
        // Calculate the deformation gradient and time derivative of the deformation gradient for all Gauss quadrature
        // points in a single matrix multiplication.  Note that since the shape function derivative matrix is ordered by
        // columns, the resulting deformation gradient will be ordered by block matrix (column vectors) components
        // Note that the indices of the components are in transposed order
        //      [F11  F21  F31  F11dot  F21dot  F31dot ]
        // FC = [F12  F22  F32  F12dot  F22dot  F32dot ]
        //      [F13  F23  F33  F13dot  F23dot  F33dot ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 6> FC = m_SD.block<NSF, 3 * NIP>(0, 3 * NIP * kl).transpose() * ebar_ebardot;

        // =============================================================================
        // Calculate each individual value of the Green-Lagrange strain component by component across all the
        // Gauss-Quadrature points at a time for the current layer to better leverage vectorized CPU instructions.
        // Note that the scaled time derivatives of the Green-Lagrange strain are added to make the later calculation of
        // the 2nd Piola-Kirchoff stresses more efficient.  The combined result is then scaled by minus the Gauss
        // quadrature weight times the element Jacobian at the corresponding Gauss point (m_kGQ) again for efficiency.
        // Results are written in Voigt notation: epsilon = [E11,E22,E33,2*E23,2*E13,2*E12]
        // =============================================================================

        // Each entry in E1 = kGQ*(E11+alpha*E11dot)
        //                  = kGQ*(1/2*(F11*F11+F21*F21+F31*F31-1)+alpha*(F11*F11dot+F21*F21dot+F31*F31dot))
        VectorNIP E_BlockDamping = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5));
        VectorNIP E1_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(0, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(0, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(0, 2));
        E1_Block.array() -= 1;
        E1_Block *= 0.5;
        E1_Block += m_Alpha * E_BlockDamping;
        E1_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E2 = kGQ*(E22+alpha*E22dot)
        //                  = kGQ*(1/2*(F12*F12+F22*F22+F32*F32-1)+alpha*(F12*F12dot+F22*F22dot+F32*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E2_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E2_Block.array() -= 1;
        E2_Block *= 0.5;
        E2_Block += m_Alpha * E_BlockDamping;
        E2_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E3 = kGQ*(E33+alpha*E33dot)
        //                  = kGQ*(1/2*(F13*F13+F23*F23+F33*F33-1)+alpha*(F13*F13dot+F23*F23dot+F33*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E3_Block = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E3_Block.array() -= 1;
        E3_Block *= 0.5;
        E3_Block += m_Alpha * E_BlockDamping;
        E3_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E4 = kGQ*(2*(E23+alpha*E23dot))
        //                  = kGQ*((F12*F13+F22*F23+F32*F33)
        //                    +alpha*(F12dot*F13+F22dot*F23+F32dot*F33 + F12*F13dot+F22*F23dot+F32*F33dot))
        E_BlockDamping.noalias() =
            FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
            FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
            FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5)) +
            FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
            FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
            FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E4_Block = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E4_Block += m_Alpha * E_BlockDamping;
        E4_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E5 = kGQ*(2*(E13+alpha*E13dot))
        //                  = kGQ*((F11*F13+F21*F23+F31*F33)
        //                    +alpha*(F11dot*F13+F21dot*F23+F31dot*F33 + F11*F13dot+F21*F23dot+F31*F33dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 5));
        VectorNIP E5_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(2 * NIP, 2));
        E5_Block += m_Alpha * E_BlockDamping;
        E5_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // Each entry in E6 = kGQ*(2*(E12+alpha*E12dot))
        //                  = kGQ*((F11*F12+F21*F22+F31*F32)
        //                    +alpha*(F11dot*F12+F21dot*F22+F31dot*F32 + F11*F12dot+F21*F22dot+F31*F32dot))
        E_BlockDamping.noalias() = FC.template block<NIP, 1>(NIP, 0).cwiseProduct(FC.template block<NIP, 1>(0, 3)) +
                                   FC.template block<NIP, 1>(NIP, 1).cwiseProduct(FC.template block<NIP, 1>(0, 4)) +
                                   FC.template block<NIP, 1>(NIP, 2).cwiseProduct(FC.template block<NIP, 1>(0, 5)) +
                                   FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 3)) +
                                   FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 4)) +
                                   FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 5));
        VectorNIP E6_Block = FC.template block<NIP, 1>(0, 0).cwiseProduct(FC.template block<NIP, 1>(NIP, 0)) +
                             FC.template block<NIP, 1>(0, 1).cwiseProduct(FC.template block<NIP, 1>(NIP, 1)) +
                             FC.template block<NIP, 1>(0, 2).cwiseProduct(FC.template block<NIP, 1>(NIP, 2));
        E6_Block += m_Alpha * E_BlockDamping;
        E6_Block.array() *= m_kGQ.block<NIP, 1>(kl * NIP, 0).array();

        // =============================================================================
        // Get the stiffness tensor in 6x6 matrix form for the current layer and rotate it in the midsurface according
        // to the user specified angle.  Note that the matrix is reordered as well to match the Voigt notation used in
        // this element compared to what is used in ChMaterialShellANCF
        // =============================================================================

        ChMatrixNM<double, 6, 6> D = m_layers[kl].GetMaterial()->Get_E_eps();
        RotateReorderStiffnessMatrix(D, m_layers[kl].Get_theta());

        // =============================================================================
        // Calculate the 2nd Piola-Kirchoff stresses in Voigt notation across all the Gauss quadrature points in the
        // current layer at a time component by component.
        // Note that the Green-Largrange strain components have been scaled have already been combined with their scaled
        // time derivatives and minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss
        // point to make the calculation of the 2nd Piola-Kirchoff stresses more efficient.
        //  kGQ*SPK2 = kGQ*[SPK2_11,SPK2_22,SPK2_33,SPK2_23,SPK2_13,SPK2_12] = D * E_Combined
        // =============================================================================

        VectorNIP SPK2_1_Block = D(0, 0) * E1_Block + D(0, 1) * E2_Block + D(0, 2) * E3_Block + D(0, 3) * E4_Block +
                                 D(0, 4) * E5_Block + D(0, 5) * E6_Block;
        VectorNIP SPK2_2_Block = D(1, 0) * E1_Block + D(1, 1) * E2_Block + D(1, 2) * E3_Block + D(1, 3) * E4_Block +
                                 D(1, 4) * E5_Block + D(1, 5) * E6_Block;
        VectorNIP SPK2_3_Block = D(2, 0) * E1_Block + D(2, 1) * E2_Block + D(2, 2) * E3_Block + D(2, 3) * E4_Block +
                                 D(2, 4) * E5_Block + D(2, 5) * E6_Block;
        VectorNIP SPK2_4_Block = D(3, 0) * E1_Block + D(3, 1) * E2_Block + D(3, 2) * E3_Block + D(3, 3) * E4_Block +
                                 D(3, 4) * E5_Block + D(3, 5) * E6_Block;
        VectorNIP SPK2_5_Block = D(4, 0) * E1_Block + D(4, 1) * E2_Block + D(4, 2) * E3_Block + D(4, 3) * E4_Block +
                                 D(4, 4) * E5_Block + D(4, 5) * E6_Block;
        VectorNIP SPK2_6_Block = D(5, 0) * E1_Block + D(5, 1) * E2_Block + D(5, 2) * E3_Block + D(5, 3) * E4_Block +
                                 D(5, 4) * E5_Block + D(5, 5) * E6_Block;

        // =============================================================================
        // Calculate the transpose of the 1st Piola-Kirchoff stresses in block tensor form whose entries have been
        // scaled by minus the Gauss quadrature weight times the element Jacobian at the corresponding Gauss point.
        // The entries are grouped by component in block matrices (column vectors)
        // P_Block = kGQ*P_transpose = kGQ*SPK2*F_transpose
        //           [kGQ*(P_transpose)_11  kGQ*(P_transpose)_12  kGQ*(P_transpose)_13 ]
        //         = [kGQ*(P_transpose)_21  kGQ*(P_transpose)_22  kGQ*(P_transpose)_23 ]
        //           [kGQ*(P_transpose)_31  kGQ*(P_transpose)_32  kGQ*(P_transpose)_33 ]
        // =============================================================================

        ChMatrixNMc<double, 3 * NIP, 3> P_Block;

        P_Block.template block<NIP, 1>(0, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_5_Block);
        P_Block.template block<NIP, 1>(0, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_1_Block) +
                                               FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_6_Block) +
                                               FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_5_Block);

        P_Block.template block<NIP, 1>(NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_4_Block);
        P_Block.template block<NIP, 1>(NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_6_Block) +
                                                 FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_2_Block) +
                                                 FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_4_Block);

        P_Block.template block<NIP, 1>(2 * NIP, 0) = FC.template block<NIP, 1>(0, 0).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 0).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 0).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 1) = FC.template block<NIP, 1>(0, 1).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 1).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 1).cwiseProduct(SPK2_3_Block);
        P_Block.template block<NIP, 1>(2 * NIP, 2) = FC.template block<NIP, 1>(0, 2).cwiseProduct(SPK2_5_Block) +
                                                     FC.template block<NIP, 1>(NIP, 2).cwiseProduct(SPK2_4_Block) +
                                                     FC.template block<NIP, 1>(2 * NIP, 2).cwiseProduct(SPK2_3_Block);

        // =============================================================================
        // Multiply the scaled first Piola-Kirchoff stresses by the shape function derivative matrix for the current
        // layer to get the generalized force vector in matrix form (in the correct order if its calculated in row-major
        // memory layout)
        // =============================================================================

        QiCompact.noalias() += m_SD.block<NSF, 3 * NIP>(0, 3 * kl * NIP) * P_Block;
    }

    // =============================================================================
    // Reshape the compact matrix form of the generalized internal force vector (stored using a row-major memory layout)
    // into its actual column vector format.  This is done by mathematically stacking the transpose of each row on top
    // of each other forming the column vector.  Due to the memory organization this is simply a reinterpretation of the
    // data
    // =============================================================================

    Eigen::Map<Vector3N> QiReshaped(QiCompact.data(), QiCompact.size());
    Fi = QiReshaped;
}